

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O1

void av1_dr_prediction_z3_avx2
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_left,int dx,int dy)

{
  uint8_t uVar1;
  undefined8 uVar2;
  ushort uVar3;
  byte bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  long lVar31;
  uint8_t *puVar32;
  uint uVar33;
  long lVar34;
  ptrdiff_t pitchSrc;
  uint uVar35;
  int iVar36;
  uint uVar37;
  long lVar38;
  ulong uVar39;
  int iVar40;
  bool bVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  ushort uVar72;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  __m128i dstvec_4 [4];
  uint8_t dstT [4096];
  undefined8 auStack_1660 [11];
  undefined8 uStack_1608;
  undefined8 local_14e0 [16];
  undefined1 local_1460 [24];
  undefined8 uStack_1448;
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [16];
  undefined1 auStack_1050 [16];
  undefined1 local_1040 [16];
  undefined1 auStack_1030 [16];
  undefined1 local_1020 [16];
  undefined1 auStack_1010 [16];
  undefined1 local_1000 [16];
  undefined1 auStack_ff0 [16];
  undefined1 local_fe0 [16];
  undefined1 auStack_fd0 [16];
  undefined1 local_fc0 [16];
  undefined1 auStack_fb0 [16];
  undefined1 local_fa0 [16];
  undefined1 auStack_f90 [16];
  undefined1 local_f80 [16];
  undefined1 auStack_f70 [16];
  undefined1 local_f60 [32];
  undefined1 local_f40 [32];
  undefined1 local_f20 [32];
  undefined1 local_f00 [32];
  undefined1 local_ee0 [32];
  undefined1 local_ec0 [32];
  undefined1 local_ea0 [32];
  undefined1 local_e80 [32];
  undefined1 local_e60 [32];
  undefined1 local_e40 [32];
  undefined1 local_e20 [32];
  undefined1 local_e00 [32];
  undefined1 local_de0 [32];
  undefined1 local_dc0 [32];
  undefined1 local_da0 [32];
  undefined1 local_d80 [32];
  undefined1 local_d60 [32];
  undefined1 local_d40 [32];
  undefined1 local_d20 [32];
  undefined1 local_d00 [32];
  undefined1 local_ce0 [32];
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  undefined1 local_c80 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  
  iVar36 = (int)left;
  bVar4 = (byte)upsample_left;
  if (bw == bh) {
    if (bw < 0x10) {
      if (bw == 4) {
        iVar36 = 7 << (bVar4 & 0x1f);
        uVar1 = left[iVar36];
        auVar47[1] = uVar1;
        auVar47[0] = uVar1;
        auVar47[2] = uVar1;
        auVar47[3] = uVar1;
        auVar47[4] = uVar1;
        auVar47[5] = uVar1;
        auVar47[6] = uVar1;
        auVar47[7] = uVar1;
        auVar47[8] = uVar1;
        auVar47[9] = uVar1;
        auVar47[10] = uVar1;
        auVar47[0xb] = uVar1;
        auVar47[0xc] = uVar1;
        auVar47[0xd] = uVar1;
        auVar47[0xe] = uVar1;
        auVar47[0xf] = uVar1;
        auVar76._8_2_ = 0x10;
        auVar76._0_8_ = 0x10001000100010;
        auVar76._10_2_ = 0x10;
        auVar76._12_2_ = 0x10;
        auVar76._14_2_ = 0x10;
        auVar76._16_2_ = 0x10;
        auVar76._18_2_ = 0x10;
        auVar76._20_2_ = 0x10;
        auVar76._22_2_ = 0x10;
        auVar76._24_2_ = 0x10;
        auVar76._26_2_ = 0x10;
        auVar76._28_2_ = 0x10;
        auVar76._30_2_ = 0x10;
        lVar31 = 0;
        auVar84._8_2_ = 0x1f;
        auVar84._0_8_ = 0x1f001f001f001f;
        auVar84._10_2_ = 0x1f;
        auVar84._12_2_ = 0x1f;
        auVar84._14_2_ = 0x1f;
        auVar84._16_2_ = 0x1f;
        auVar84._18_2_ = 0x1f;
        auVar84._20_2_ = 0x1f;
        auVar84._22_2_ = 0x1f;
        auVar84._24_2_ = 0x1f;
        auVar84._26_2_ = 0x1f;
        auVar84._28_2_ = 0x1f;
        auVar84._30_2_ = 0x1f;
        lVar34 = 0;
        uVar35 = dy;
        do {
          iVar40 = (int)uVar35 >> (6 - bVar4 & 0x1f);
          uVar37 = iVar36 - iVar40 >> (bVar4 & 0x1f);
          lVar38 = lVar31;
          if ((int)uVar37 < 1) {
            do {
              *(undefined1 (*) [16])(local_1060 + lVar38) = auVar47;
              lVar38 = lVar38 + 0x10;
            } while (lVar38 != 0x40);
          }
          else {
            uVar33 = 4;
            if ((int)uVar37 < 4) {
              uVar33 = uVar37;
            }
            auVar93 = *(undefined1 (*) [16])(left + iVar40);
            if (upsample_left == 0) {
              auVar92 = *(undefined1 (*) [16])(left + (long)iVar40 + 1);
              uVar3 = (ushort)(uVar35 >> 1);
              uVar72 = uVar3 & 0x1f;
              auVar107._0_8_ =
                   CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
              auVar107._8_2_ = uVar72;
              auVar107._10_2_ = uVar72;
              auVar107._12_2_ = uVar72;
              auVar107._14_2_ = uVar72;
              auVar107._16_2_ = uVar72;
              auVar107._18_2_ = uVar72;
              auVar107._20_2_ = uVar72;
              auVar107._22_2_ = uVar72;
              auVar107._24_2_ = uVar72;
              auVar107._26_2_ = uVar72;
              auVar107._28_2_ = uVar72;
              auVar107._30_2_ = uVar72;
            }
            else {
              auVar93 = vpshufb_avx(auVar93,_DAT_005109e0);
              auVar92 = vpsrldq_avx(auVar93,8);
              auVar106._0_2_ = (undefined2)uVar35;
              auVar106._2_2_ = auVar106._0_2_;
              auVar106._4_2_ = auVar106._0_2_;
              auVar106._6_2_ = auVar106._0_2_;
              auVar106._8_2_ = auVar106._0_2_;
              auVar106._10_2_ = auVar106._0_2_;
              auVar106._12_2_ = auVar106._0_2_;
              auVar106._14_2_ = auVar106._0_2_;
              auVar106._16_2_ = auVar106._0_2_;
              auVar106._18_2_ = auVar106._0_2_;
              auVar106._20_2_ = auVar106._0_2_;
              auVar106._22_2_ = auVar106._0_2_;
              auVar106._24_2_ = auVar106._0_2_;
              auVar106._26_2_ = auVar106._0_2_;
              auVar106._28_2_ = auVar106._0_2_;
              auVar106._30_2_ = auVar106._0_2_;
              auVar107 = vpsllw_avx2(auVar106,ZEXT416((uint)upsample_left));
              auVar107 = vpsrlw_avx2(auVar107,1);
              auVar107 = vpand_avx2(auVar107,auVar84);
            }
            auVar106 = vpmovzxbw_avx2(auVar93);
            auVar60 = vpmovzxbw_avx2(auVar92);
            auVar60 = vpsubw_avx2(auVar60,auVar106);
            auVar60 = vpmullw_avx2(auVar60,auVar107);
            auVar107 = vpsllw_avx2(auVar106,5);
            auVar107 = vpaddw_avx2(auVar107,auVar76);
            auVar107 = vpaddw_avx2(auVar60,auVar107);
            auVar107 = vpsrlw_avx2(auVar107,5);
            auVar93 = vpackuswb_avx(auVar107._0_16_,auVar107._16_16_);
            auVar93 = vpblendvb_avx(auVar47,auVar93,*(undefined1 (*) [16])BaseMask[uVar33]);
            *(undefined1 (*) [16])(local_1060 + lVar34 * 0x10) = auVar93;
            uVar35 = uVar35 + dy;
          }
          if ((int)uVar37 < 1) break;
          lVar34 = lVar34 + 1;
          lVar31 = lVar31 + 0x10;
        } while (lVar34 != 4);
        auVar47 = vpunpcklbw_avx(local_1060,auStack_1050);
        auVar93 = vpunpcklbw_avx(local_1040,auStack_1030);
        auVar47 = vpunpcklwd_avx(auVar47,auVar93);
        *(int *)dst = auVar47._0_4_;
        *(int *)(dst + stride) = auVar47._4_4_;
        *(int *)(dst + stride * 2) = auVar47._8_4_;
        *(int *)(dst + stride * 3) = auVar47._12_4_;
        return;
      }
      if (bw != 8) {
        return;
      }
      iVar36 = 0xf << (bVar4 & 0x1f);
      uVar1 = left[iVar36];
      auVar93[1] = uVar1;
      auVar93[0] = uVar1;
      auVar93[2] = uVar1;
      auVar93[3] = uVar1;
      auVar93[4] = uVar1;
      auVar93[5] = uVar1;
      auVar93[6] = uVar1;
      auVar93[7] = uVar1;
      auVar93[8] = uVar1;
      auVar93[9] = uVar1;
      auVar93[10] = uVar1;
      auVar93[0xb] = uVar1;
      auVar93[0xc] = uVar1;
      auVar93[0xd] = uVar1;
      auVar93[0xe] = uVar1;
      auVar93[0xf] = uVar1;
      auVar60._8_2_ = 0x10;
      auVar60._0_8_ = 0x10001000100010;
      auVar60._10_2_ = 0x10;
      auVar60._12_2_ = 0x10;
      auVar60._14_2_ = 0x10;
      auVar60._16_2_ = 0x10;
      auVar60._18_2_ = 0x10;
      auVar60._20_2_ = 0x10;
      auVar60._22_2_ = 0x10;
      auVar60._24_2_ = 0x10;
      auVar60._26_2_ = 0x10;
      auVar60._28_2_ = 0x10;
      auVar60._30_2_ = 0x10;
      lVar31 = 0;
      auVar79._8_2_ = 0x1f;
      auVar79._0_8_ = 0x1f001f001f001f;
      auVar79._10_2_ = 0x1f;
      auVar79._12_2_ = 0x1f;
      auVar79._14_2_ = 0x1f;
      auVar79._16_2_ = 0x1f;
      auVar79._18_2_ = 0x1f;
      auVar79._20_2_ = 0x1f;
      auVar79._22_2_ = 0x1f;
      auVar79._24_2_ = 0x1f;
      auVar79._26_2_ = 0x1f;
      auVar79._28_2_ = 0x1f;
      auVar79._30_2_ = 0x1f;
      lVar34 = 0;
      uVar35 = dy;
      do {
        iVar40 = (int)uVar35 >> (6 - bVar4 & 0x1f);
        uVar37 = iVar36 - iVar40 >> (bVar4 & 0x1f);
        lVar38 = lVar31;
        if ((int)uVar37 < 1) {
          do {
            *(undefined1 (*) [16])(local_1060 + lVar38) = auVar93;
            lVar38 = lVar38 + 0x10;
          } while (lVar38 != 0x80);
        }
        else {
          uVar33 = 8;
          if ((int)uVar37 < 8) {
            uVar33 = uVar37;
          }
          auVar47 = *(undefined1 (*) [16])(left + iVar40);
          if (upsample_left == 0) {
            auVar92 = *(undefined1 (*) [16])(left + (long)iVar40 + 1);
            uVar3 = (ushort)(uVar35 >> 1);
            uVar72 = uVar3 & 0x1f;
            auVar99._0_8_ = CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f
            ;
            auVar99._8_2_ = uVar72;
            auVar99._10_2_ = uVar72;
            auVar99._12_2_ = uVar72;
            auVar99._14_2_ = uVar72;
            auVar99._16_2_ = uVar72;
            auVar99._18_2_ = uVar72;
            auVar99._20_2_ = uVar72;
            auVar99._22_2_ = uVar72;
            auVar99._24_2_ = uVar72;
            auVar99._26_2_ = uVar72;
            auVar99._28_2_ = uVar72;
            auVar99._30_2_ = uVar72;
          }
          else {
            auVar47 = vpshufb_avx(auVar47,_DAT_005109e0);
            auVar92 = vpsrldq_avx(auVar47,8);
            auVar98._0_2_ = (undefined2)uVar35;
            auVar98._2_2_ = auVar98._0_2_;
            auVar98._4_2_ = auVar98._0_2_;
            auVar98._6_2_ = auVar98._0_2_;
            auVar98._8_2_ = auVar98._0_2_;
            auVar98._10_2_ = auVar98._0_2_;
            auVar98._12_2_ = auVar98._0_2_;
            auVar98._14_2_ = auVar98._0_2_;
            auVar98._16_2_ = auVar98._0_2_;
            auVar98._18_2_ = auVar98._0_2_;
            auVar98._20_2_ = auVar98._0_2_;
            auVar98._22_2_ = auVar98._0_2_;
            auVar98._24_2_ = auVar98._0_2_;
            auVar98._26_2_ = auVar98._0_2_;
            auVar98._28_2_ = auVar98._0_2_;
            auVar98._30_2_ = auVar98._0_2_;
            auVar76 = vpsllw_avx2(auVar98,ZEXT416((uint)upsample_left));
            auVar76 = vpsrlw_avx2(auVar76,1);
            auVar99 = vpand_avx2(auVar76,auVar79);
          }
          auVar76 = vpmovzxbw_avx2(auVar47);
          auVar84 = vpmovzxbw_avx2(auVar92);
          auVar84 = vpsubw_avx2(auVar84,auVar76);
          auVar84 = vpmullw_avx2(auVar84,auVar99);
          auVar76 = vpsllw_avx2(auVar76,5);
          auVar76 = vpaddw_avx2(auVar76,auVar60);
          auVar76 = vpaddw_avx2(auVar84,auVar76);
          auVar76 = vpsrlw_avx2(auVar76,5);
          auVar47 = vpackuswb_avx(auVar76._0_16_,auVar76._16_16_);
          auVar47 = vpblendvb_avx(auVar93,auVar47,*(undefined1 (*) [16])BaseMask[uVar33]);
          *(undefined1 (*) [16])(local_1060 + lVar34 * 0x10) = auVar47;
          uVar35 = uVar35 + dy;
        }
        if ((int)uVar37 < 1) break;
        lVar34 = lVar34 + 1;
        lVar31 = lVar31 + 0x10;
      } while (lVar34 != 8);
      auVar47 = vpunpcklbw_avx(local_1060,auStack_1050);
      auVar92 = vpunpcklbw_avx(local_1040,auStack_1030);
      auVar46 = vpunpcklbw_avx(local_1020,auStack_1010);
      auVar51 = vpunpcklbw_avx(local_1000,auStack_ff0);
      auVar93 = vpunpcklwd_avx(auVar47,auVar92);
      auVar53 = vpunpcklwd_avx(auVar46,auVar51);
      auVar42 = vpunpckldq_avx(auVar93,auVar53);
      *(long *)dst = auVar42._0_8_;
      uVar2 = vpextrq_avx(auVar42,1);
      *(undefined8 *)(dst + stride) = uVar2;
      auVar93 = vpunpckhdq_avx(auVar93,auVar53);
      auVar47 = vpunpckhwd_avx(auVar47,auVar92);
      *(long *)(dst + stride * 2) = auVar93._0_8_;
      uVar2 = vpextrq_avx(auVar93,1);
      *(undefined8 *)(dst + stride * 3) = uVar2;
      auVar93 = vpunpckhwd_avx(auVar46,auVar51);
      auVar92 = vpunpckldq_avx(auVar47,auVar93);
      *(long *)(dst + stride * 4) = auVar92._0_8_;
      uVar2 = vpextrq_avx(auVar92,1);
      *(undefined8 *)(dst + stride * 5) = uVar2;
      auVar47 = vpunpckhdq_avx(auVar47,auVar93);
      *(long *)(dst + stride * 6) = auVar47._0_8_;
      lVar31 = stride * 7;
LAB_00357e3f:
      uVar2 = vpextrq_avx(auVar47,1);
      *(undefined8 *)(dst + lVar31) = uVar2;
      return;
    }
    if (bw == 0x10) {
      iVar36 = 0x1f << (bVar4 & 0x1f);
      uVar1 = left[iVar36];
      auVar92[1] = uVar1;
      auVar92[0] = uVar1;
      auVar92[2] = uVar1;
      auVar92[3] = uVar1;
      auVar92[4] = uVar1;
      auVar92[5] = uVar1;
      auVar92[6] = uVar1;
      auVar92[7] = uVar1;
      auVar92[8] = uVar1;
      auVar92[9] = uVar1;
      auVar92[10] = uVar1;
      auVar92[0xb] = uVar1;
      auVar92[0xc] = uVar1;
      auVar92[0xd] = uVar1;
      auVar92[0xe] = uVar1;
      auVar92[0xf] = uVar1;
      auVar63._8_2_ = 0x10;
      auVar63._0_8_ = 0x10001000100010;
      auVar63._10_2_ = 0x10;
      auVar63._12_2_ = 0x10;
      auVar63._14_2_ = 0x10;
      auVar63._16_2_ = 0x10;
      auVar63._18_2_ = 0x10;
      auVar63._20_2_ = 0x10;
      auVar63._22_2_ = 0x10;
      auVar63._24_2_ = 0x10;
      auVar63._26_2_ = 0x10;
      auVar63._28_2_ = 0x10;
      auVar63._30_2_ = 0x10;
      lVar31 = 0;
      auVar82._8_2_ = 0x1f;
      auVar82._0_8_ = 0x1f001f001f001f;
      auVar82._10_2_ = 0x1f;
      auVar82._12_2_ = 0x1f;
      auVar82._14_2_ = 0x1f;
      auVar82._16_2_ = 0x1f;
      auVar82._18_2_ = 0x1f;
      auVar82._20_2_ = 0x1f;
      auVar82._22_2_ = 0x1f;
      auVar82._24_2_ = 0x1f;
      auVar82._26_2_ = 0x1f;
      auVar82._28_2_ = 0x1f;
      auVar82._30_2_ = 0x1f;
      lVar34 = 0;
      uVar35 = dy;
      do {
        iVar40 = (int)uVar35 >> (6 - bVar4 & 0x1f);
        uVar37 = iVar36 - iVar40 >> (bVar4 & 0x1f);
        lVar38 = lVar31;
        if ((int)uVar37 < 1) {
          do {
            *(undefined1 (*) [16])(local_1060 + lVar38) = auVar92;
            lVar38 = lVar38 + 0x10;
          } while (lVar38 != 0x100);
        }
        else {
          uVar33 = 0x10;
          if ((int)uVar37 < 0x10) {
            uVar33 = uVar37;
          }
          auVar47 = *(undefined1 (*) [16])(left + iVar40);
          if (upsample_left == 0) {
            auVar93 = *(undefined1 (*) [16])(left + (long)iVar40 + 1);
            uVar3 = (ushort)(uVar35 >> 1);
            uVar72 = uVar3 & 0x1f;
            auVar105._0_8_ =
                 CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
            auVar105._8_2_ = uVar72;
            auVar105._10_2_ = uVar72;
            auVar105._12_2_ = uVar72;
            auVar105._14_2_ = uVar72;
            auVar105._16_2_ = uVar72;
            auVar105._18_2_ = uVar72;
            auVar105._20_2_ = uVar72;
            auVar105._22_2_ = uVar72;
            auVar105._24_2_ = uVar72;
            auVar105._26_2_ = uVar72;
            auVar105._28_2_ = uVar72;
            auVar105._30_2_ = uVar72;
          }
          else {
            auVar47 = vpshufb_avx(auVar47,_DAT_005109e0);
            auVar93 = vpsrldq_avx(auVar47,8);
            auVar104._0_2_ = (undefined2)uVar35;
            auVar104._2_2_ = auVar104._0_2_;
            auVar104._4_2_ = auVar104._0_2_;
            auVar104._6_2_ = auVar104._0_2_;
            auVar104._8_2_ = auVar104._0_2_;
            auVar104._10_2_ = auVar104._0_2_;
            auVar104._12_2_ = auVar104._0_2_;
            auVar104._14_2_ = auVar104._0_2_;
            auVar104._16_2_ = auVar104._0_2_;
            auVar104._18_2_ = auVar104._0_2_;
            auVar104._20_2_ = auVar104._0_2_;
            auVar104._22_2_ = auVar104._0_2_;
            auVar104._24_2_ = auVar104._0_2_;
            auVar104._26_2_ = auVar104._0_2_;
            auVar104._28_2_ = auVar104._0_2_;
            auVar104._30_2_ = auVar104._0_2_;
            auVar76 = vpsllw_avx2(auVar104,ZEXT416((uint)upsample_left));
            auVar76 = vpsrlw_avx2(auVar76,1);
            auVar105 = vpand_avx2(auVar76,auVar82);
          }
          auVar76 = vpmovzxbw_avx2(auVar47);
          auVar84 = vpmovzxbw_avx2(auVar93);
          auVar84 = vpsubw_avx2(auVar84,auVar76);
          auVar84 = vpmullw_avx2(auVar84,auVar105);
          auVar76 = vpsllw_avx2(auVar76,5);
          auVar76 = vpaddw_avx2(auVar76,auVar63);
          auVar76 = vpaddw_avx2(auVar84,auVar76);
          auVar76 = vpsrlw_avx2(auVar76,5);
          auVar47 = vpackuswb_avx(auVar76._0_16_,auVar76._16_16_);
          auVar47 = vpblendvb_avx(auVar92,auVar47,*(undefined1 (*) [16])BaseMask[uVar33]);
          *(undefined1 (*) [16])(local_1060 + lVar34 * 0x10) = auVar47;
          uVar35 = uVar35 + dy;
        }
        if ((int)uVar37 < 1) break;
        lVar34 = lVar34 + 1;
        lVar31 = lVar31 + 0x10;
      } while (lVar34 != 0x10);
      auVar92 = vpunpcklbw_avx(local_1060,auStack_1050);
      auVar46 = vpunpcklbw_avx(local_1040,auStack_1030);
      auVar51 = vpunpcklbw_avx(local_1020,auStack_1010);
      auVar53 = vpunpcklbw_avx(local_1000,auStack_ff0);
      auVar47 = vpunpcklwd_avx(auVar92,auVar46);
      auVar93 = vpunpcklwd_avx(auVar51,auVar53);
      auVar45 = vpunpckldq_avx(auVar47,auVar93);
      auVar47 = vpunpckhdq_avx(auVar47,auVar93);
      auVar42 = vpunpcklbw_avx(local_fe0,auStack_fd0);
      auVar48 = vpunpcklbw_avx(local_fc0,auStack_fb0);
      auVar44 = vpunpcklbw_avx(local_fa0,auStack_f90);
      auVar50 = vpunpcklbw_avx(local_f80,auStack_f70);
      auVar93 = vpunpcklwd_avx(auVar42,auVar48);
      auVar49 = vpunpcklwd_avx(auVar44,auVar50);
      auVar52 = vpunpckldq_avx(auVar93,auVar49);
      auVar93 = vpunpckhdq_avx(auVar93,auVar49);
      local_1460._0_16_ = vpunpcklqdq_avx(auVar45,auVar52);
      unique0x00102d80 = vpunpckhqdq_avx(auVar45,auVar52);
      local_1440._0_16_ = vpunpcklqdq_avx(auVar47,auVar93);
      local_1440._16_16_ = vpunpckhqdq_avx(auVar47,auVar93);
      auVar47 = vpunpckhwd_avx(auVar92,auVar46);
      auVar93 = vpunpckhwd_avx(auVar51,auVar53);
      auVar92 = vpunpckhwd_avx(auVar42,auVar48);
      auVar46 = vpunpckhwd_avx(auVar44,auVar50);
      auVar51 = vpunpckldq_avx(auVar47,auVar93);
      auVar47 = vpunpckhdq_avx(auVar47,auVar93);
      auVar53 = vpunpckldq_avx(auVar92,auVar46);
      auVar93 = vpunpckhdq_avx(auVar92,auVar46);
      local_1420._0_16_ = vpunpcklqdq_avx(auVar51,auVar53);
      local_1420._16_16_ = vpunpckhqdq_avx(auVar51,auVar53);
      local_1400._0_16_ = vpunpcklqdq_avx(auVar47,auVar93);
      local_1400._16_16_ = vpunpckhqdq_avx(auVar47,auVar93);
      auVar47 = vpunpckhbw_avx(local_1060,auStack_1050);
      auVar93 = vpunpckhbw_avx(local_1040,auStack_1030);
      auVar92 = vpunpckhbw_avx(local_1020,auStack_1010);
      auVar46 = vpunpckhbw_avx(local_1000,auStack_ff0);
      auVar51 = vpunpckhbw_avx(local_fe0,auStack_fd0);
      auVar53 = vpunpckhbw_avx(local_fc0,auStack_fb0);
      auVar42 = vpunpckhbw_avx(local_fa0,auStack_f90);
      auVar48 = vpunpckhbw_avx(local_f80,auStack_f70);
      auVar44 = vpunpcklwd_avx(auVar47,auVar93);
      auVar50 = vpunpcklwd_avx(auVar92,auVar46);
      auVar49 = vpunpcklwd_avx(auVar51,auVar53);
      auVar45 = vpunpcklwd_avx(auVar42,auVar48);
      auVar52 = vpunpckldq_avx(auVar44,auVar50);
      auVar44 = vpunpckhdq_avx(auVar44,auVar50);
      auVar54 = vpunpckldq_avx(auVar49,auVar45);
      auVar50 = vpunpckhdq_avx(auVar49,auVar45);
      local_13e0._0_16_ = vpunpcklqdq_avx(auVar52,auVar54);
      local_13e0._16_16_ = vpunpckhqdq_avx(auVar52,auVar54);
      local_13c0._0_16_ = vpunpcklqdq_avx(auVar44,auVar50);
      local_13c0._16_16_ = vpunpckhqdq_avx(auVar44,auVar50);
      auVar47 = vpunpckhwd_avx(auVar47,auVar93);
      auVar93 = vpunpckhwd_avx(auVar92,auVar46);
      auVar92 = vpunpckhwd_avx(auVar51,auVar53);
      auVar46 = vpunpckhwd_avx(auVar42,auVar48);
      auVar51 = vpunpckldq_avx(auVar47,auVar93);
      auVar47 = vpunpckhdq_avx(auVar47,auVar93);
      auVar53 = vpunpckldq_avx(auVar92,auVar46);
      auVar93 = vpunpckhdq_avx(auVar92,auVar46);
      local_13a0._0_16_ = vpunpcklqdq_avx(auVar51,auVar53);
      local_13a0._16_16_ = vpunpckhqdq_avx(auVar51,auVar53);
      local_1380._0_16_ = vpunpcklqdq_avx(auVar47,auVar93);
      local_1380._16_16_ = vpunpckhqdq_avx(auVar47,auVar93);
      lVar31 = 0;
      do {
        uVar2 = *(undefined8 *)(local_1460 + lVar31 + 8);
        *(undefined8 *)dst = *(undefined8 *)(local_1460 + lVar31);
        *(undefined8 *)(dst + 8) = uVar2;
        lVar31 = lVar31 + 0x10;
        dst = dst + stride;
      } while (lVar31 != 0x100);
      return;
    }
    if (bw == 0x20) {
      uVar1 = left[0x3f];
      auVar46[1] = uVar1;
      auVar46[0] = uVar1;
      auVar46[2] = uVar1;
      auVar46[3] = uVar1;
      auVar46[4] = uVar1;
      auVar46[5] = uVar1;
      auVar46[6] = uVar1;
      auVar46[7] = uVar1;
      auVar46[8] = uVar1;
      auVar46[9] = uVar1;
      auVar46[10] = uVar1;
      auVar46[0xb] = uVar1;
      auVar46[0xc] = uVar1;
      auVar46[0xd] = uVar1;
      auVar46[0xe] = uVar1;
      auVar46[0xf] = uVar1;
      auVar55[0x10] = uVar1;
      auVar55._0_16_ = auVar46;
      auVar55[0x11] = uVar1;
      auVar55[0x12] = uVar1;
      auVar55[0x13] = uVar1;
      auVar55[0x14] = uVar1;
      auVar55[0x15] = uVar1;
      auVar55[0x16] = uVar1;
      auVar55[0x17] = uVar1;
      auVar55[0x18] = uVar1;
      auVar55[0x19] = uVar1;
      auVar55[0x1a] = uVar1;
      auVar55[0x1b] = uVar1;
      auVar55[0x1c] = uVar1;
      auVar55[0x1d] = uVar1;
      auVar55[0x1e] = uVar1;
      auVar55[0x1f] = uVar1;
      lVar31 = 0;
      auVar64._8_2_ = 0x10;
      auVar64._0_8_ = 0x10001000100010;
      auVar64._10_2_ = 0x10;
      auVar64._12_2_ = 0x10;
      auVar64._14_2_ = 0x10;
      auVar64._16_2_ = 0x10;
      auVar64._18_2_ = 0x10;
      auVar64._20_2_ = 0x10;
      auVar64._22_2_ = 0x10;
      auVar64._24_2_ = 0x10;
      auVar64._26_2_ = 0x10;
      auVar64._28_2_ = 0x10;
      auVar64._30_2_ = 0x10;
      lVar34 = 0;
      uVar35 = dy;
      do {
        iVar36 = (int)uVar35 >> 6;
        lVar38 = lVar31;
        if (iVar36 < 0x3f) {
          uVar37 = -(iVar36 + -0x3f);
          uVar3 = (ushort)(uVar35 >> 1);
          uVar72 = uVar3 & 0x1f;
          auVar73._0_8_ = CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
          auVar73._8_2_ = uVar72;
          auVar73._10_2_ = uVar72;
          auVar73._12_2_ = uVar72;
          auVar73._14_2_ = uVar72;
          auVar73._16_2_ = uVar72;
          auVar73._18_2_ = uVar72;
          auVar73._20_2_ = uVar72;
          auVar73._22_2_ = uVar72;
          auVar73._24_2_ = uVar72;
          auVar73._26_2_ = uVar72;
          auVar73._28_2_ = uVar72;
          auVar73._30_2_ = uVar72;
          lVar38 = 0;
          do {
            auVar76 = auVar55;
            if (lVar38 < (int)uVar37) {
              auVar76 = vpmovzxbw_avx2(*(undefined1 (*) [16])(left + lVar38 + iVar36));
              auVar84 = vpmovzxbw_avx2(*(undefined1 (*) [16])(left + lVar38 + (long)iVar36 + 1));
              auVar84 = vpsubw_avx2(auVar84,auVar76);
              auVar84 = vpmullw_avx2(auVar84,auVar73);
              auVar76 = vpsllw_avx2(auVar76,5);
              auVar76 = vpaddw_avx2(auVar76,auVar64);
              auVar76 = vpaddw_avx2(auVar84,auVar76);
              auVar76 = vpsrlw_avx2(auVar76,5);
              auVar83._0_16_ = ZEXT116(0) * auVar46 + ZEXT116(1) * auVar76._16_16_;
              auVar83._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar46
              ;
              auVar76 = vpackuswb_avx2(auVar76,auVar83);
            }
            *(undefined1 (*) [32])(local_1460 + lVar38 * 2) = auVar76;
            lVar38 = lVar38 + 0x10;
          } while (lVar38 == 0x10);
          if (0x1f < (int)uVar37) {
            uVar37 = 0x20;
          }
          local_1440 = vperm2i128_avx2(_local_1460,local_1440,0x20);
          auVar76 = vpblendvb_avx2(auVar55,local_1440,(undefined1  [32])BaseMask[uVar37]);
          *(undefined1 (*) [32])(local_1060 + lVar34 * 0x20) = auVar76;
          uVar35 = uVar35 + dy;
        }
        else {
          do {
            *(undefined1 (*) [32])(local_1060 + lVar38) = auVar55;
            lVar38 = lVar38 + 0x20;
          } while (lVar38 != 0x400);
        }
        if (0x3e < iVar36) break;
        lVar34 = lVar34 + 1;
        lVar31 = lVar31 + 0x20;
      } while (lVar34 != 0x20);
      auVar7._16_16_ = auStack_1050;
      auVar7._0_16_ = local_1060;
      auVar10._16_16_ = auStack_1030;
      auVar10._0_16_ = local_1040;
      auVar13._16_16_ = auStack_1010;
      auVar13._0_16_ = local_1020;
      auVar16._16_16_ = auStack_ff0;
      auVar16._0_16_ = local_1000;
      auVar107 = vpunpcklbw_avx2(auVar7,auVar10);
      auVar106 = vpunpcklbw_avx2(auVar13,auVar16);
      auVar19._16_16_ = auStack_fd0;
      auVar19._0_16_ = local_fe0;
      auVar22._16_16_ = auStack_fb0;
      auVar22._0_16_ = local_fc0;
      auVar60 = vpunpcklbw_avx2(auVar19,auVar22);
      auVar25._16_16_ = auStack_f90;
      auVar25._0_16_ = local_fa0;
      auVar28._16_16_ = auStack_f70;
      auVar28._0_16_ = local_f80;
      auVar79 = vpunpcklbw_avx2(auVar25,auVar28);
      auVar76 = vpunpcklwd_avx2(auVar107,auVar106);
      auVar84 = vpunpcklwd_avx2(auVar60,auVar79);
      auVar104 = vpunpckldq_avx2(auVar76,auVar84);
      auVar76 = vpunpckhdq_avx2(auVar76,auVar84);
      auVar99 = vpunpcklbw_avx2(local_f60,local_f40);
      auVar98 = vpunpcklbw_avx2(local_f20,local_f00);
      auVar63 = vpunpcklbw_avx2(local_ee0,local_ec0);
      auVar82 = vpunpcklbw_avx2(local_ea0,local_e80);
      auVar84 = vpunpcklwd_avx2(auVar99,auVar98);
      auVar105 = vpunpcklwd_avx2(auVar63,auVar82);
      auVar55 = vpunpckldq_avx2(auVar84,auVar105);
      auVar84 = vpunpckhdq_avx2(auVar84,auVar105);
      _local_1460 = vpunpcklqdq_avx2(auVar104,auVar55);
      local_1440 = vpunpckhqdq_avx2(auVar104,auVar55);
      local_1420 = vpunpcklqdq_avx2(auVar76,auVar84);
      local_1400 = vpunpckhqdq_avx2(auVar76,auVar84);
      auVar76 = vpunpckhwd_avx2(auVar107,auVar106);
      auVar84 = vpunpckhwd_avx2(auVar60,auVar79);
      auVar107 = vpunpckhwd_avx2(auVar99,auVar98);
      auVar106 = vpunpckhwd_avx2(auVar63,auVar82);
      auVar60 = vpunpckldq_avx2(auVar76,auVar84);
      auVar76 = vpunpckhdq_avx2(auVar76,auVar84);
      auVar79 = vpunpckldq_avx2(auVar107,auVar106);
      auVar84 = vpunpckhdq_avx2(auVar107,auVar106);
      local_13e0 = vpunpcklqdq_avx2(auVar60,auVar79);
      local_13c0 = vpunpckhqdq_avx2(auVar60,auVar79);
      local_13a0 = vpunpcklqdq_avx2(auVar76,auVar84);
      local_1380 = vpunpckhqdq_avx2(auVar76,auVar84);
      auVar76 = vpunpckhbw_avx2(auVar7,auVar10);
      auVar84 = vpunpckhbw_avx2(auVar13,auVar16);
      auVar107 = vpunpckhbw_avx2(auVar19,auVar22);
      auVar106 = vpunpckhbw_avx2(auVar25,auVar28);
      auVar60 = vpunpckhbw_avx2(local_f60,local_f40);
      auVar79 = vpunpckhbw_avx2(local_f20,local_f00);
      auVar99 = vpunpckhbw_avx2(local_ee0,local_ec0);
      auVar98 = vpunpckhbw_avx2(local_ea0,local_e80);
      auVar63 = vpunpcklwd_avx2(auVar76,auVar84);
      auVar82 = vpunpcklwd_avx2(auVar107,auVar106);
      auVar105 = vpunpcklwd_avx2(auVar60,auVar79);
      auVar104 = vpunpcklwd_avx2(auVar99,auVar98);
      auVar55 = vpunpckldq_avx2(auVar63,auVar82);
      auVar63 = vpunpckhdq_avx2(auVar63,auVar82);
      auVar64 = vpunpckldq_avx2(auVar105,auVar104);
      auVar82 = vpunpckhdq_avx2(auVar105,auVar104);
      local_1360 = vpunpcklqdq_avx2(auVar55,auVar64);
      local_1340 = vpunpckhqdq_avx2(auVar55,auVar64);
      local_1320 = vpunpcklqdq_avx2(auVar63,auVar82);
      local_1300 = vpunpckhqdq_avx2(auVar63,auVar82);
      auVar76 = vpunpckhwd_avx2(auVar76,auVar84);
      auVar84 = vpunpckhwd_avx2(auVar107,auVar106);
      auVar107 = vpunpckhwd_avx2(auVar60,auVar79);
      auVar106 = vpunpckhwd_avx2(auVar99,auVar98);
      auVar60 = vpunpckldq_avx2(auVar76,auVar84);
      auVar76 = vpunpckhdq_avx2(auVar76,auVar84);
      auVar79 = vpunpckldq_avx2(auVar107,auVar106);
      auVar84 = vpunpckhdq_avx2(auVar107,auVar106);
      local_12e0 = vpunpcklqdq_avx2(auVar60,auVar79);
      local_12c0 = vpunpckhqdq_avx2(auVar60,auVar79);
      local_12a0 = vpunpcklqdq_avx2(auVar76,auVar84);
      local_1280 = vpunpckhqdq_avx2(auVar76,auVar84);
      auVar107 = vpunpcklbw_avx2(local_e60,local_e40);
      auVar106 = vpunpcklbw_avx2(local_e20,local_e00);
      auVar60 = vpunpcklbw_avx2(local_de0,local_dc0);
      auVar79 = vpunpcklbw_avx2(local_da0,local_d80);
      auVar76 = vpunpcklwd_avx2(auVar107,auVar106);
      auVar84 = vpunpcklwd_avx2(auVar60,auVar79);
      auVar104 = vpunpckldq_avx2(auVar76,auVar84);
      auVar76 = vpunpckhdq_avx2(auVar76,auVar84);
      auVar99 = vpunpcklbw_avx2(local_d60,local_d40);
      auVar98 = vpunpcklbw_avx2(local_d20,local_d00);
      auVar63 = vpunpcklbw_avx2(local_ce0,local_cc0);
      auVar82 = vpunpcklbw_avx2(local_ca0,local_c80);
      auVar84 = vpunpcklwd_avx2(auVar99,auVar98);
      auVar105 = vpunpcklwd_avx2(auVar63,auVar82);
      auVar55 = vpunpckldq_avx2(auVar84,auVar105);
      auVar84 = vpunpckhdq_avx2(auVar84,auVar105);
      local_1260 = vpunpcklqdq_avx2(auVar104,auVar55);
      local_1240 = vpunpckhqdq_avx2(auVar104,auVar55);
      local_1220 = vpunpcklqdq_avx2(auVar76,auVar84);
      local_1200 = vpunpckhqdq_avx2(auVar76,auVar84);
      auVar76 = vpunpckhwd_avx2(auVar107,auVar106);
      auVar84 = vpunpckhwd_avx2(auVar60,auVar79);
      auVar107 = vpunpckhwd_avx2(auVar99,auVar98);
      auVar106 = vpunpckhwd_avx2(auVar63,auVar82);
      auVar60 = vpunpckldq_avx2(auVar76,auVar84);
      auVar76 = vpunpckhdq_avx2(auVar76,auVar84);
      auVar79 = vpunpckldq_avx2(auVar107,auVar106);
      auVar84 = vpunpckhdq_avx2(auVar107,auVar106);
      local_11e0 = vpunpcklqdq_avx2(auVar60,auVar79);
      local_11c0 = vpunpckhqdq_avx2(auVar60,auVar79);
      local_11a0 = vpunpcklqdq_avx2(auVar76,auVar84);
      local_1180 = vpunpckhqdq_avx2(auVar76,auVar84);
      auVar76 = vpunpckhbw_avx2(local_e60,local_e40);
      auVar84 = vpunpckhbw_avx2(local_e20,local_e00);
      auVar107 = vpunpckhbw_avx2(local_de0,local_dc0);
      auVar106 = vpunpckhbw_avx2(local_da0,local_d80);
      auVar60 = vpunpckhbw_avx2(local_d60,local_d40);
      auVar79 = vpunpckhbw_avx2(local_d20,local_d00);
      auVar99 = vpunpckhbw_avx2(local_ce0,local_cc0);
      auVar98 = vpunpckhbw_avx2(local_ca0,local_c80);
      auVar63 = vpunpcklwd_avx2(auVar76,auVar84);
      auVar82 = vpunpcklwd_avx2(auVar107,auVar106);
      auVar105 = vpunpcklwd_avx2(auVar60,auVar79);
      auVar104 = vpunpcklwd_avx2(auVar99,auVar98);
      auVar55 = vpunpckldq_avx2(auVar63,auVar82);
      auVar63 = vpunpckhdq_avx2(auVar63,auVar82);
      auVar64 = vpunpckldq_avx2(auVar105,auVar104);
      auVar82 = vpunpckhdq_avx2(auVar105,auVar104);
      local_1160 = vpunpcklqdq_avx2(auVar55,auVar64);
      local_1140 = vpunpckhqdq_avx2(auVar55,auVar64);
      local_1120 = vpunpcklqdq_avx2(auVar63,auVar82);
      local_1100 = vpunpckhqdq_avx2(auVar63,auVar82);
      auVar76 = vpunpckhwd_avx2(auVar76,auVar84);
      auVar84 = vpunpckhwd_avx2(auVar107,auVar106);
      auVar107 = vpunpckhwd_avx2(auVar60,auVar79);
      auVar106 = vpunpckhwd_avx2(auVar99,auVar98);
      auVar60 = vpunpckldq_avx2(auVar76,auVar84);
      auVar76 = vpunpckhdq_avx2(auVar76,auVar84);
      auVar79 = vpunpckldq_avx2(auVar107,auVar106);
      auVar84 = vpunpckhdq_avx2(auVar107,auVar106);
      local_10e0 = vpunpcklqdq_avx2(auVar60,auVar79);
      local_10c0 = vpunpckhqdq_avx2(auVar60,auVar79);
      local_10a0 = vpunpcklqdq_avx2(auVar76,auVar84);
      local_1080 = vpunpckhqdq_avx2(auVar76,auVar84);
      puVar32 = dst + 0x10;
      lVar31 = 0x200;
      do {
        uVar2 = *(undefined8 *)((long)auStack_1660 + lVar31 + 8);
        *(undefined8 *)(puVar32 + -0x10) = *(undefined8 *)((long)auStack_1660 + lVar31);
        *(undefined8 *)(puVar32 + -8) = uVar2;
        uVar2 = *(undefined8 *)(local_1460 + lVar31 + 8);
        *(undefined8 *)puVar32 = *(undefined8 *)(local_1460 + lVar31);
        *(undefined8 *)(puVar32 + 8) = uVar2;
        lVar31 = lVar31 + 0x20;
        puVar32 = puVar32 + stride;
      } while (lVar31 != 0x400);
      puVar32 = dst + stride * 0x10 + 0x10;
      lVar31 = 0x200;
      do {
        uVar2 = *(undefined8 *)((long)auStack_1660 + lVar31 + 0x18);
        *(undefined8 *)puVar32 = *(undefined8 *)((long)auStack_1660 + lVar31 + 0x10);
        *(undefined8 *)(puVar32 + 8) = uVar2;
        uVar2 = *(undefined8 *)(local_1440 + lVar31 + -8);
        *(undefined8 *)(puVar32 + 0x10) = *(undefined8 *)(local_1460 + lVar31 + 0x10);
        *(undefined8 *)(puVar32 + 0x18) = uVar2;
        lVar31 = lVar31 + 0x20;
        puVar32 = puVar32 + stride;
      } while (lVar31 != 0x400);
      return;
    }
    if (bw != 0x40) {
      return;
    }
    uStack_1608 = 0x357843;
    dr_prediction_z1_64xN_avx2(0x40,local_1060,0x40,left,dy,iVar36);
    iVar36 = 0x40;
LAB_0035aafb:
    pitchSrc = 0x40;
    iVar40 = 0x40;
LAB_0035ab01:
    uStack_1608 = 0x35ab06;
    transpose(local_1060,pitchSrc,dst,stride,iVar36,iVar40);
  }
  else {
    if (bw < bh) {
      if (bw * 2 == bh) {
        switch(bw << 0x1e | bw - 4U >> 2) {
        case 0:
          iVar36 = 0xb << (bVar4 & 0x1f);
          uVar1 = left[iVar36];
          auVar42[1] = uVar1;
          auVar42[0] = uVar1;
          auVar42[2] = uVar1;
          auVar42[3] = uVar1;
          auVar42[4] = uVar1;
          auVar42[5] = uVar1;
          auVar42[6] = uVar1;
          auVar42[7] = uVar1;
          auVar42[8] = uVar1;
          auVar42[9] = uVar1;
          auVar42[10] = uVar1;
          auVar42[0xb] = uVar1;
          auVar42[0xc] = uVar1;
          auVar42[0xd] = uVar1;
          auVar42[0xe] = uVar1;
          auVar42[0xf] = uVar1;
          auVar58._8_2_ = 0x10;
          auVar58._0_8_ = 0x10001000100010;
          auVar58._10_2_ = 0x10;
          auVar58._12_2_ = 0x10;
          auVar58._14_2_ = 0x10;
          auVar58._16_2_ = 0x10;
          auVar58._18_2_ = 0x10;
          auVar58._20_2_ = 0x10;
          auVar58._22_2_ = 0x10;
          auVar58._24_2_ = 0x10;
          auVar58._26_2_ = 0x10;
          auVar58._28_2_ = 0x10;
          auVar58._30_2_ = 0x10;
          lVar31 = 0;
          auVar77._8_2_ = 0x1f;
          auVar77._0_8_ = 0x1f001f001f001f;
          auVar77._10_2_ = 0x1f;
          auVar77._12_2_ = 0x1f;
          auVar77._14_2_ = 0x1f;
          auVar77._16_2_ = 0x1f;
          auVar77._18_2_ = 0x1f;
          auVar77._20_2_ = 0x1f;
          auVar77._22_2_ = 0x1f;
          auVar77._24_2_ = 0x1f;
          auVar77._26_2_ = 0x1f;
          auVar77._28_2_ = 0x1f;
          auVar77._30_2_ = 0x1f;
          lVar34 = 0;
          uVar35 = dy;
          do {
            iVar40 = (int)uVar35 >> (6 - bVar4 & 0x1f);
            uVar37 = iVar36 - iVar40 >> (bVar4 & 0x1f);
            lVar38 = lVar31;
            if ((int)uVar37 < 1) {
              do {
                *(undefined1 (*) [16])(local_1460 + lVar38) = auVar42;
                lVar38 = lVar38 + 0x10;
              } while (lVar38 != 0x40);
            }
            else {
              uVar33 = 8;
              if ((int)uVar37 < 8) {
                uVar33 = uVar37;
              }
              auVar47 = *(undefined1 (*) [16])(left + iVar40);
              if (upsample_left == 0) {
                auVar93 = *(undefined1 (*) [16])(left + (long)iVar40 + 1);
                uVar3 = (ushort)(uVar35 >> 1);
                uVar72 = uVar3 & 0x1f;
                auVar95._0_8_ =
                     CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
                auVar95._8_2_ = uVar72;
                auVar95._10_2_ = uVar72;
                auVar95._12_2_ = uVar72;
                auVar95._14_2_ = uVar72;
                auVar95._16_2_ = uVar72;
                auVar95._18_2_ = uVar72;
                auVar95._20_2_ = uVar72;
                auVar95._22_2_ = uVar72;
                auVar95._24_2_ = uVar72;
                auVar95._26_2_ = uVar72;
                auVar95._28_2_ = uVar72;
                auVar95._30_2_ = uVar72;
              }
              else {
                auVar47 = vpshufb_avx(auVar47,_DAT_005109e0);
                auVar93 = vpsrldq_avx(auVar47,8);
                auVar94._0_2_ = (undefined2)uVar35;
                auVar94._2_2_ = auVar94._0_2_;
                auVar94._4_2_ = auVar94._0_2_;
                auVar94._6_2_ = auVar94._0_2_;
                auVar94._8_2_ = auVar94._0_2_;
                auVar94._10_2_ = auVar94._0_2_;
                auVar94._12_2_ = auVar94._0_2_;
                auVar94._14_2_ = auVar94._0_2_;
                auVar94._16_2_ = auVar94._0_2_;
                auVar94._18_2_ = auVar94._0_2_;
                auVar94._20_2_ = auVar94._0_2_;
                auVar94._22_2_ = auVar94._0_2_;
                auVar94._24_2_ = auVar94._0_2_;
                auVar94._26_2_ = auVar94._0_2_;
                auVar94._28_2_ = auVar94._0_2_;
                auVar94._30_2_ = auVar94._0_2_;
                auVar76 = vpsllw_avx2(auVar94,ZEXT416((uint)upsample_left));
                auVar76 = vpsrlw_avx2(auVar76,1);
                auVar95 = vpand_avx2(auVar76,auVar77);
              }
              auVar76 = vpmovzxbw_avx2(auVar47);
              auVar84 = vpmovzxbw_avx2(auVar93);
              auVar84 = vpsubw_avx2(auVar84,auVar76);
              auVar84 = vpmullw_avx2(auVar84,auVar95);
              auVar76 = vpsllw_avx2(auVar76,5);
              auVar76 = vpaddw_avx2(auVar76,auVar58);
              auVar76 = vpaddw_avx2(auVar84,auVar76);
              auVar76 = vpsrlw_avx2(auVar76,5);
              auVar47 = vpackuswb_avx(auVar76._0_16_,auVar76._16_16_);
              auVar47 = vpblendvb_avx(auVar42,auVar47,*(undefined1 (*) [16])BaseMask[uVar33]);
              *(undefined1 (*) [16])(local_1460 + lVar34 * 0x10) = auVar47;
              uVar35 = uVar35 + dy;
            }
            if ((int)uVar37 < 1) break;
            lVar34 = lVar34 + 1;
            lVar31 = lVar31 + 0x10;
          } while (lVar34 != 4);
          auVar47 = vpunpcklbw_avx(local_1460._0_16_,stack0xffffffffffffebb0);
          auVar93 = vpunpcklbw_avx(local_1440._0_16_,local_1440._16_16_);
          local_1060 = vpunpcklwd_avx(auVar47,auVar93);
          local_1020 = vpunpckhwd_avx(auVar47,auVar93);
          auStack_1050 = vpsrldq_avx(local_1060,4);
          local_1040 = vpsrldq_avx(local_1060,8);
          auStack_1030 = vpsrldq_avx(local_1060,0xc);
          auStack_1010 = vpsrldq_avx(local_1020,4);
          local_1000 = vpsrldq_avx(local_1020,8);
          auStack_ff0 = vpsrldq_avx(local_1020,0xc);
          lVar31 = 0;
          do {
            *(undefined4 *)dst = *(undefined4 *)(local_1060 + lVar31);
            lVar31 = lVar31 + 0x10;
            dst = dst + stride;
          } while (lVar31 != 0x80);
          return;
        case 1:
          iVar36 = 0x17 << (bVar4 & 0x1f);
          uVar1 = left[iVar36];
          auVar53[1] = uVar1;
          auVar53[0] = uVar1;
          auVar53[2] = uVar1;
          auVar53[3] = uVar1;
          auVar53[4] = uVar1;
          auVar53[5] = uVar1;
          auVar53[6] = uVar1;
          auVar53[7] = uVar1;
          auVar53[8] = uVar1;
          auVar53[9] = uVar1;
          auVar53[10] = uVar1;
          auVar53[0xb] = uVar1;
          auVar53[0xc] = uVar1;
          auVar53[0xd] = uVar1;
          auVar53[0xe] = uVar1;
          auVar53[0xf] = uVar1;
          auVar70._8_2_ = 0x10;
          auVar70._0_8_ = 0x10001000100010;
          auVar70._10_2_ = 0x10;
          auVar70._12_2_ = 0x10;
          auVar70._14_2_ = 0x10;
          auVar70._16_2_ = 0x10;
          auVar70._18_2_ = 0x10;
          auVar70._20_2_ = 0x10;
          auVar70._22_2_ = 0x10;
          auVar70._24_2_ = 0x10;
          auVar70._26_2_ = 0x10;
          auVar70._28_2_ = 0x10;
          auVar70._30_2_ = 0x10;
          lVar31 = 0;
          auVar90._8_2_ = 0x1f;
          auVar90._0_8_ = 0x1f001f001f001f;
          auVar90._10_2_ = 0x1f;
          auVar90._12_2_ = 0x1f;
          auVar90._14_2_ = 0x1f;
          auVar90._16_2_ = 0x1f;
          auVar90._18_2_ = 0x1f;
          auVar90._20_2_ = 0x1f;
          auVar90._22_2_ = 0x1f;
          auVar90._24_2_ = 0x1f;
          auVar90._26_2_ = 0x1f;
          auVar90._28_2_ = 0x1f;
          auVar90._30_2_ = 0x1f;
          lVar34 = 0;
          uVar35 = dy;
          do {
            iVar40 = (int)uVar35 >> (6 - bVar4 & 0x1f);
            uVar37 = iVar36 - iVar40 >> (bVar4 & 0x1f);
            lVar38 = lVar31;
            if ((int)uVar37 < 1) {
              do {
                *(undefined1 (*) [16])(local_1060 + lVar38) = auVar53;
                lVar38 = lVar38 + 0x10;
              } while (lVar38 != 0x80);
            }
            else {
              uVar33 = 0x10;
              if ((int)uVar37 < 0x10) {
                uVar33 = uVar37;
              }
              auVar47 = *(undefined1 (*) [16])(left + iVar40);
              if (upsample_left == 0) {
                auVar93 = *(undefined1 (*) [16])(left + (long)iVar40 + 1);
                uVar3 = (ushort)(uVar35 >> 1);
                uVar72 = uVar3 & 0x1f;
                auVar115._0_8_ =
                     CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
                auVar115._8_2_ = uVar72;
                auVar115._10_2_ = uVar72;
                auVar115._12_2_ = uVar72;
                auVar115._14_2_ = uVar72;
                auVar115._16_2_ = uVar72;
                auVar115._18_2_ = uVar72;
                auVar115._20_2_ = uVar72;
                auVar115._22_2_ = uVar72;
                auVar115._24_2_ = uVar72;
                auVar115._26_2_ = uVar72;
                auVar115._28_2_ = uVar72;
                auVar115._30_2_ = uVar72;
              }
              else {
                auVar47 = vpshufb_avx(auVar47,_DAT_005109e0);
                auVar93 = vpsrldq_avx(auVar47,8);
                auVar114._0_2_ = (undefined2)uVar35;
                auVar114._2_2_ = auVar114._0_2_;
                auVar114._4_2_ = auVar114._0_2_;
                auVar114._6_2_ = auVar114._0_2_;
                auVar114._8_2_ = auVar114._0_2_;
                auVar114._10_2_ = auVar114._0_2_;
                auVar114._12_2_ = auVar114._0_2_;
                auVar114._14_2_ = auVar114._0_2_;
                auVar114._16_2_ = auVar114._0_2_;
                auVar114._18_2_ = auVar114._0_2_;
                auVar114._20_2_ = auVar114._0_2_;
                auVar114._22_2_ = auVar114._0_2_;
                auVar114._24_2_ = auVar114._0_2_;
                auVar114._26_2_ = auVar114._0_2_;
                auVar114._28_2_ = auVar114._0_2_;
                auVar114._30_2_ = auVar114._0_2_;
                auVar76 = vpsllw_avx2(auVar114,ZEXT416((uint)upsample_left));
                auVar76 = vpsrlw_avx2(auVar76,1);
                auVar115 = vpand_avx2(auVar76,auVar90);
              }
              auVar76 = vpmovzxbw_avx2(auVar47);
              auVar84 = vpmovzxbw_avx2(auVar93);
              auVar84 = vpsubw_avx2(auVar84,auVar76);
              auVar84 = vpmullw_avx2(auVar84,auVar115);
              auVar76 = vpsllw_avx2(auVar76,5);
              auVar76 = vpaddw_avx2(auVar76,auVar70);
              auVar76 = vpaddw_avx2(auVar84,auVar76);
              auVar76 = vpsrlw_avx2(auVar76,5);
              auVar47 = vpackuswb_avx(auVar76._0_16_,auVar76._16_16_);
              auVar47 = vpblendvb_avx(auVar53,auVar47,*(undefined1 (*) [16])BaseMask[uVar33]);
              *(undefined1 (*) [16])(local_1060 + lVar34 * 0x10) = auVar47;
              uVar35 = uVar35 + dy;
            }
            if ((int)uVar37 < 1) break;
            lVar34 = lVar34 + 1;
            lVar31 = lVar31 + 0x10;
          } while (lVar34 != 8);
          auVar42 = vpunpcklbw_avx(local_1060,auStack_1050);
          auVar48 = vpunpcklbw_avx(local_1040,auStack_1030);
          auVar44 = vpunpcklbw_avx(local_1020,auStack_1010);
          auVar50 = vpunpcklbw_avx(local_1000,auStack_ff0);
          auVar47 = vpunpckhbw_avx(local_1060,auStack_1050);
          auVar93 = vpunpckhbw_avx(local_1040,auStack_1030);
          auVar92 = vpunpckhbw_avx(local_1020,auStack_1010);
          auVar46 = vpunpckhbw_avx(local_1000,auStack_ff0);
          auVar51 = vpunpcklwd_avx(auVar42,auVar48);
          auVar53 = vpunpcklwd_avx(auVar44,auVar50);
          auVar49 = vpunpcklwd_avx(auVar47,auVar93);
          auVar45 = vpunpcklwd_avx(auVar92,auVar46);
          auVar52 = vpunpckldq_avx(auVar51,auVar53);
          auVar51 = vpunpckhdq_avx(auVar51,auVar53);
          auVar54 = vpunpckldq_avx(auVar49,auVar45);
          auVar53 = vpunpckhdq_avx(auVar49,auVar45);
          local_1460._0_16_ = vpunpcklqdq_avx(auVar52,auVar54);
          unique0x00102d80 = vpunpckhqdq_avx(auVar52,auVar54);
          local_1440._0_16_ = vpunpcklqdq_avx(auVar51,auVar53);
          local_1440._16_16_ = vpunpckhqdq_avx(auVar51,auVar53);
          auVar51 = vpunpckhwd_avx(auVar42,auVar48);
          auVar53 = vpunpckhwd_avx(auVar44,auVar50);
          auVar47 = vpunpckhwd_avx(auVar47,auVar93);
          auVar93 = vpunpckhwd_avx(auVar92,auVar46);
          auVar46 = vpunpckldq_avx(auVar51,auVar53);
          auVar92 = vpunpckhdq_avx(auVar51,auVar53);
          auVar51 = vpunpckldq_avx(auVar47,auVar93);
          auVar47 = vpunpckhdq_avx(auVar47,auVar93);
          local_1420._0_16_ = vpunpcklqdq_avx(auVar46,auVar51);
          local_1420._16_16_ = vpunpckhqdq_avx(auVar46,auVar51);
          local_1400._0_16_ = vpunpcklqdq_avx(auVar92,auVar47);
          local_1400._16_16_ = vpunpckhqdq_avx(auVar92,auVar47);
          lVar31 = 0;
          do {
            auVar47 = *(undefined1 (*) [16])(local_1460 + lVar31);
            *(long *)dst = auVar47._0_8_;
            uVar2 = vpextrq_avx(auVar47,1);
            *(undefined8 *)(dst + stride * 8) = uVar2;
            dst = dst + stride;
            lVar31 = lVar31 + 0x10;
          } while (lVar31 != 0x80);
          return;
        default:
          return;
        case 3:
          uVar1 = left[0x2f];
          auVar51[1] = uVar1;
          auVar51[0] = uVar1;
          auVar51[2] = uVar1;
          auVar51[3] = uVar1;
          auVar51[4] = uVar1;
          auVar51[5] = uVar1;
          auVar51[6] = uVar1;
          auVar51[7] = uVar1;
          auVar51[8] = uVar1;
          auVar51[9] = uVar1;
          auVar51[10] = uVar1;
          auVar51[0xb] = uVar1;
          auVar51[0xc] = uVar1;
          auVar51[0xd] = uVar1;
          auVar51[0xe] = uVar1;
          auVar51[0xf] = uVar1;
          auVar57[0x10] = uVar1;
          auVar57._0_16_ = auVar51;
          auVar57[0x11] = uVar1;
          auVar57[0x12] = uVar1;
          auVar57[0x13] = uVar1;
          auVar57[0x14] = uVar1;
          auVar57[0x15] = uVar1;
          auVar57[0x16] = uVar1;
          auVar57[0x17] = uVar1;
          auVar57[0x18] = uVar1;
          auVar57[0x19] = uVar1;
          auVar57[0x1a] = uVar1;
          auVar57[0x1b] = uVar1;
          auVar57[0x1c] = uVar1;
          auVar57[0x1d] = uVar1;
          auVar57[0x1e] = uVar1;
          auVar57[0x1f] = uVar1;
          lVar31 = 0;
          auVar68._8_2_ = 0x10;
          auVar68._0_8_ = 0x10001000100010;
          auVar68._10_2_ = 0x10;
          auVar68._12_2_ = 0x10;
          auVar68._14_2_ = 0x10;
          auVar68._16_2_ = 0x10;
          auVar68._18_2_ = 0x10;
          auVar68._20_2_ = 0x10;
          auVar68._22_2_ = 0x10;
          auVar68._24_2_ = 0x10;
          auVar68._26_2_ = 0x10;
          auVar68._28_2_ = 0x10;
          auVar68._30_2_ = 0x10;
          lVar34 = 0;
          uVar35 = dy;
          do {
            iVar36 = (int)uVar35 >> 6;
            lVar38 = lVar31;
            if (iVar36 < 0x2f) {
              uVar37 = -(iVar36 + -0x2f);
              uVar3 = (ushort)(uVar35 >> 1);
              uVar72 = uVar3 & 0x1f;
              auVar75._0_8_ =
                   CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
              auVar75._8_2_ = uVar72;
              auVar75._10_2_ = uVar72;
              auVar75._12_2_ = uVar72;
              auVar75._14_2_ = uVar72;
              auVar75._16_2_ = uVar72;
              auVar75._18_2_ = uVar72;
              auVar75._20_2_ = uVar72;
              auVar75._22_2_ = uVar72;
              auVar75._24_2_ = uVar72;
              auVar75._26_2_ = uVar72;
              auVar75._28_2_ = uVar72;
              auVar75._30_2_ = uVar72;
              lVar38 = 0;
              do {
                auVar76 = auVar57;
                if (lVar38 < (int)uVar37) {
                  auVar76 = vpmovzxbw_avx2(*(undefined1 (*) [16])(left + lVar38 + iVar36));
                  auVar84 = vpmovzxbw_avx2(*(undefined1 (*) [16])(left + lVar38 + (long)iVar36 + 1))
                  ;
                  auVar84 = vpsubw_avx2(auVar84,auVar76);
                  auVar84 = vpmullw_avx2(auVar84,auVar75);
                  auVar76 = vpsllw_avx2(auVar76,5);
                  auVar76 = vpaddw_avx2(auVar76,auVar68);
                  auVar76 = vpaddw_avx2(auVar84,auVar76);
                  auVar76 = vpsrlw_avx2(auVar76,5);
                  auVar88._0_16_ = ZEXT116(0) * auVar51 + ZEXT116(1) * auVar76._16_16_;
                  auVar88._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar51;
                  auVar76 = vpackuswb_avx2(auVar76,auVar88);
                }
                *(undefined1 (*) [32])(local_1460 + lVar38 * 2) = auVar76;
                lVar38 = lVar38 + 0x10;
              } while (lVar38 == 0x10);
              uVar39 = (ulong)uVar37;
              if (0x1f < (int)uVar37) {
                uVar39 = 0x20;
              }
              local_1440 = vperm2i128_avx2(_local_1460,local_1440,0x20);
              auVar76 = vpblendvb_avx2(auVar57,local_1440,(undefined1  [32])BaseMask[uVar39]);
              *(undefined1 (*) [32])(local_1060 + lVar34 * 0x20) = auVar76;
              uVar35 = uVar35 + dy;
            }
            else {
              do {
                *(undefined1 (*) [32])(local_1060 + lVar38) = auVar57;
                lVar38 = lVar38 + 0x20;
              } while (lVar38 != 0x200);
            }
            if (0x2e < iVar36) break;
            lVar34 = lVar34 + 1;
            lVar31 = lVar31 + 0x20;
          } while (lVar34 != 0x10);
          auVar9._16_16_ = auStack_1050;
          auVar9._0_16_ = local_1060;
          auVar12._16_16_ = auStack_1030;
          auVar12._0_16_ = local_1040;
          auVar15._16_16_ = auStack_1010;
          auVar15._0_16_ = local_1020;
          auVar18._16_16_ = auStack_ff0;
          auVar18._0_16_ = local_1000;
          auVar107 = vpunpcklbw_avx2(auVar9,auVar12);
          auVar106 = vpunpcklbw_avx2(auVar15,auVar18);
          auVar21._16_16_ = auStack_fd0;
          auVar21._0_16_ = local_fe0;
          auVar24._16_16_ = auStack_fb0;
          auVar24._0_16_ = local_fc0;
          auVar60 = vpunpcklbw_avx2(auVar21,auVar24);
          auVar27._16_16_ = auStack_f90;
          auVar27._0_16_ = local_fa0;
          auVar30._16_16_ = auStack_f70;
          auVar30._0_16_ = local_f80;
          auVar79 = vpunpcklbw_avx2(auVar27,auVar30);
          auVar76 = vpunpcklwd_avx2(auVar107,auVar106);
          auVar84 = vpunpcklwd_avx2(auVar60,auVar79);
          auVar104 = vpunpckldq_avx2(auVar76,auVar84);
          auVar76 = vpunpckhdq_avx2(auVar76,auVar84);
          auVar99 = vpunpcklbw_avx2(local_f60,local_f40);
          auVar98 = vpunpcklbw_avx2(local_f20,local_f00);
          auVar63 = vpunpcklbw_avx2(local_ee0,local_ec0);
          auVar82 = vpunpcklbw_avx2(local_ea0,local_e80);
          auVar84 = vpunpcklwd_avx2(auVar99,auVar98);
          auVar105 = vpunpcklwd_avx2(auVar63,auVar82);
          auVar55 = vpunpckldq_avx2(auVar84,auVar105);
          auVar84 = vpunpckhdq_avx2(auVar84,auVar105);
          _local_1460 = vpunpcklqdq_avx2(auVar104,auVar55);
          local_1440 = vpunpckhqdq_avx2(auVar104,auVar55);
          local_1420 = vpunpcklqdq_avx2(auVar76,auVar84);
          local_1400 = vpunpckhqdq_avx2(auVar76,auVar84);
          auVar76 = vpunpckhwd_avx2(auVar107,auVar106);
          auVar84 = vpunpckhwd_avx2(auVar60,auVar79);
          auVar107 = vpunpckhwd_avx2(auVar99,auVar98);
          auVar106 = vpunpckhwd_avx2(auVar63,auVar82);
          auVar60 = vpunpckldq_avx2(auVar76,auVar84);
          auVar76 = vpunpckhdq_avx2(auVar76,auVar84);
          auVar79 = vpunpckldq_avx2(auVar107,auVar106);
          auVar84 = vpunpckhdq_avx2(auVar107,auVar106);
          local_13e0 = vpunpcklqdq_avx2(auVar60,auVar79);
          local_13c0 = vpunpckhqdq_avx2(auVar60,auVar79);
          local_13a0 = vpunpcklqdq_avx2(auVar76,auVar84);
          local_1380 = vpunpckhqdq_avx2(auVar76,auVar84);
          auVar76 = vpunpckhbw_avx2(auVar9,auVar12);
          auVar84 = vpunpckhbw_avx2(auVar15,auVar18);
          auVar107 = vpunpckhbw_avx2(auVar21,auVar24);
          auVar106 = vpunpckhbw_avx2(auVar27,auVar30);
          auVar60 = vpunpckhbw_avx2(local_f60,local_f40);
          auVar79 = vpunpckhbw_avx2(local_f20,local_f00);
          auVar99 = vpunpckhbw_avx2(local_ee0,local_ec0);
          auVar98 = vpunpckhbw_avx2(local_ea0,local_e80);
          auVar63 = vpunpcklwd_avx2(auVar76,auVar84);
          auVar82 = vpunpcklwd_avx2(auVar107,auVar106);
          auVar105 = vpunpcklwd_avx2(auVar60,auVar79);
          auVar104 = vpunpcklwd_avx2(auVar99,auVar98);
          auVar55 = vpunpckldq_avx2(auVar63,auVar82);
          auVar63 = vpunpckhdq_avx2(auVar63,auVar82);
          auVar64 = vpunpckldq_avx2(auVar105,auVar104);
          auVar82 = vpunpckhdq_avx2(auVar105,auVar104);
          local_1360 = vpunpcklqdq_avx2(auVar55,auVar64);
          local_1340 = vpunpckhqdq_avx2(auVar55,auVar64);
          local_1320 = vpunpcklqdq_avx2(auVar63,auVar82);
          local_1300 = vpunpckhqdq_avx2(auVar63,auVar82);
          auVar76 = vpunpckhwd_avx2(auVar76,auVar84);
          auVar84 = vpunpckhwd_avx2(auVar107,auVar106);
          auVar107 = vpunpckhwd_avx2(auVar60,auVar79);
          auVar106 = vpunpckhwd_avx2(auVar99,auVar98);
          auVar60 = vpunpckldq_avx2(auVar76,auVar84);
          auVar76 = vpunpckhdq_avx2(auVar76,auVar84);
          auVar79 = vpunpckldq_avx2(auVar107,auVar106);
          auVar84 = vpunpckhdq_avx2(auVar107,auVar106);
          local_12e0 = vpunpcklqdq_avx2(auVar60,auVar79);
          local_12c0 = vpunpckhqdq_avx2(auVar60,auVar79);
          local_12a0 = vpunpcklqdq_avx2(auVar76,auVar84);
          local_1280 = vpunpckhqdq_avx2(auVar76,auVar84);
          lVar31 = 0;
          do {
            uVar2 = *(undefined8 *)(local_1460 + lVar31 + 8);
            uVar5 = *(undefined8 *)(local_1460 + lVar31 + 0x10);
            uVar6 = *(undefined8 *)(local_1440 + lVar31 + -8);
            *(undefined8 *)dst = *(undefined8 *)(local_1460 + lVar31);
            *(undefined8 *)(dst + 8) = uVar2;
            *(undefined8 *)(dst + stride * 0x10 + 0x10) = uVar5;
            *(undefined8 *)(dst + stride * 0x10 + 0x18) = uVar6;
            dst = dst + stride;
            lVar31 = lVar31 + 0x20;
          } while (lVar31 != 0x200);
          return;
        case 7:
          uStack_1608 = 0x35aae7;
          dr_prediction_z1_64xN_avx2(0x20,local_1060,0x40,left,dy,iVar36);
          iVar36 = 0x20;
        }
      }
      else {
        if (bw != 0x10) {
          if (bw == 8) {
            uVar1 = left[0x27];
            auVar48[1] = uVar1;
            auVar48[0] = uVar1;
            auVar48[2] = uVar1;
            auVar48[3] = uVar1;
            auVar48[4] = uVar1;
            auVar48[5] = uVar1;
            auVar48[6] = uVar1;
            auVar48[7] = uVar1;
            auVar48[8] = uVar1;
            auVar48[9] = uVar1;
            auVar48[10] = uVar1;
            auVar48[0xb] = uVar1;
            auVar48[0xc] = uVar1;
            auVar48[0xd] = uVar1;
            auVar48[0xe] = uVar1;
            auVar48[0xf] = uVar1;
            auVar56[0x10] = uVar1;
            auVar56._0_16_ = auVar48;
            auVar56[0x11] = uVar1;
            auVar56[0x12] = uVar1;
            auVar56[0x13] = uVar1;
            auVar56[0x14] = uVar1;
            auVar56[0x15] = uVar1;
            auVar56[0x16] = uVar1;
            auVar56[0x17] = uVar1;
            auVar56[0x18] = uVar1;
            auVar56[0x19] = uVar1;
            auVar56[0x1a] = uVar1;
            auVar56[0x1b] = uVar1;
            auVar56[0x1c] = uVar1;
            auVar56[0x1d] = uVar1;
            auVar56[0x1e] = uVar1;
            auVar56[0x1f] = uVar1;
            lVar31 = 0;
            auVar65._8_2_ = 0x10;
            auVar65._0_8_ = 0x10001000100010;
            auVar65._10_2_ = 0x10;
            auVar65._12_2_ = 0x10;
            auVar65._14_2_ = 0x10;
            auVar65._16_2_ = 0x10;
            auVar65._18_2_ = 0x10;
            auVar65._20_2_ = 0x10;
            auVar65._22_2_ = 0x10;
            auVar65._24_2_ = 0x10;
            auVar65._26_2_ = 0x10;
            auVar65._28_2_ = 0x10;
            auVar65._30_2_ = 0x10;
            lVar34 = 0;
            uVar35 = dy;
            do {
              iVar36 = (int)uVar35 >> 6;
              lVar38 = lVar31;
              if (iVar36 < 0x27) {
                uVar37 = -(iVar36 + -0x27);
                uVar3 = (ushort)(uVar35 >> 1);
                uVar72 = uVar3 & 0x1f;
                auVar74._0_8_ =
                     CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
                auVar74._8_2_ = uVar72;
                auVar74._10_2_ = uVar72;
                auVar74._12_2_ = uVar72;
                auVar74._14_2_ = uVar72;
                auVar74._16_2_ = uVar72;
                auVar74._18_2_ = uVar72;
                auVar74._20_2_ = uVar72;
                auVar74._22_2_ = uVar72;
                auVar74._24_2_ = uVar72;
                auVar74._26_2_ = uVar72;
                auVar74._28_2_ = uVar72;
                auVar74._30_2_ = uVar72;
                lVar38 = 0;
                do {
                  auVar76 = auVar56;
                  if (lVar38 < (int)uVar37) {
                    auVar76 = vpmovzxbw_avx2(*(undefined1 (*) [16])(left + lVar38 + iVar36));
                    auVar84 = vpmovzxbw_avx2(*(undefined1 (*) [16])
                                              (left + lVar38 + (long)iVar36 + 1));
                    auVar84 = vpsubw_avx2(auVar84,auVar76);
                    auVar84 = vpmullw_avx2(auVar84,auVar74);
                    auVar76 = vpsllw_avx2(auVar76,5);
                    auVar76 = vpaddw_avx2(auVar76,auVar65);
                    auVar76 = vpaddw_avx2(auVar84,auVar76);
                    auVar76 = vpsrlw_avx2(auVar76,5);
                    auVar85._0_16_ = ZEXT116(0) * auVar48 + ZEXT116(1) * auVar76._16_16_;
                    auVar85._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar48;
                    auVar76 = vpackuswb_avx2(auVar76,auVar85);
                  }
                  *(undefined1 (*) [32])(local_1460 + lVar38 * 2) = auVar76;
                  lVar38 = lVar38 + 0x10;
                } while (lVar38 == 0x10);
                if (0x1f < (int)uVar37) {
                  uVar37 = 0x20;
                }
                local_1440 = vperm2i128_avx2(_local_1460,local_1440,0x20);
                auVar76 = vpblendvb_avx2(auVar56,local_1440,(undefined1  [32])BaseMask[uVar37]);
                *(undefined1 (*) [32])(local_1060 + lVar34 * 0x20) = auVar76;
                uVar35 = uVar35 + dy;
              }
              else {
                do {
                  *(undefined1 (*) [32])(local_1060 + lVar38) = auVar56;
                  lVar38 = lVar38 + 0x20;
                } while (lVar38 != 0x100);
              }
              if (0x26 < iVar36) break;
              lVar34 = lVar34 + 1;
              lVar31 = lVar31 + 0x20;
            } while (lVar34 != 8);
            local_e80 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            local_ea0 = local_e80;
            local_ec0 = local_e80;
            local_ee0 = local_e80;
            local_f00 = local_e80;
            local_f20 = local_e80;
            local_f40 = local_e80;
            local_f60 = local_e80;
            auVar8._16_16_ = auStack_1050;
            auVar8._0_16_ = local_1060;
            auVar11._16_16_ = auStack_1030;
            auVar11._0_16_ = local_1040;
            auVar14._16_16_ = auStack_1010;
            auVar14._0_16_ = local_1020;
            auVar17._16_16_ = auStack_ff0;
            auVar17._0_16_ = local_1000;
            auVar84 = vpunpcklbw_avx2(auVar8,auVar11);
            auVar107 = vpunpcklbw_avx2(auVar14,auVar17);
            auVar20._16_16_ = auStack_fd0;
            auVar20._0_16_ = local_fe0;
            auVar23._16_16_ = auStack_fb0;
            auVar23._0_16_ = local_fc0;
            auVar106 = vpunpcklbw_avx2(auVar20,auVar23);
            auVar26._16_16_ = auStack_f90;
            auVar26._0_16_ = local_fa0;
            auVar29._16_16_ = auStack_f70;
            auVar29._0_16_ = local_f80;
            auVar60 = vpunpcklbw_avx2(auVar26,auVar29);
            auVar76 = vpunpcklwd_avx2(auVar84,auVar107);
            auVar79 = vpunpcklwd_avx2(auVar106,auVar60);
            auVar99 = vpunpckldq_avx2(auVar76,auVar79);
            auVar76 = vpunpckhdq_avx2(auVar76,auVar79);
            _local_1460 = vpblendd_avx2(auVar99,local_e80,0xcc);
            local_1440 = vpsrldq_avx2(auVar99,8);
            local_1420 = vpblendd_avx2(auVar76,local_e80,0xcc);
            local_1400 = vpsrldq_avx2(auVar76,8);
            auVar76 = vpunpckhwd_avx2(auVar84,auVar107);
            auVar84 = vpunpckhwd_avx2(auVar106,auVar60);
            auVar107 = vpunpckldq_avx2(auVar76,auVar84);
            auVar76 = vpunpckhdq_avx2(auVar76,auVar84);
            local_13e0 = vpblendd_avx2(auVar107,local_e80,0xcc);
            local_13c0 = vpsrldq_avx2(auVar107,8);
            local_13a0 = vpblendd_avx2(auVar76,local_e80,0xcc);
            local_1380 = vpsrldq_avx2(auVar76,8);
            auVar76 = vpunpckhbw_avx2(auVar8,auVar11);
            auVar84 = vpunpckhbw_avx2(auVar14,auVar17);
            auVar107 = vpunpckhbw_avx2(auVar20,auVar23);
            auVar106 = vpunpckhbw_avx2(auVar26,auVar29);
            auVar60 = vpunpcklwd_avx2(auVar76,auVar84);
            auVar79 = vpunpcklwd_avx2(auVar107,auVar106);
            auVar99 = vpunpckldq_avx2(auVar60,auVar79);
            auVar60 = vpunpckhdq_avx2(auVar60,auVar79);
            local_1360 = vpblendd_avx2(auVar99,local_e80,0xcc);
            local_1340 = vpsrldq_avx2(auVar99,8);
            local_1320 = vpblendd_avx2(auVar60,local_e80,0xcc);
            local_1300 = vpsrldq_avx2(auVar60,8);
            auVar76 = vpunpckhwd_avx2(auVar76,auVar84);
            auVar84 = vpunpckhwd_avx2(auVar107,auVar106);
            auVar107 = vpunpckldq_avx2(auVar76,auVar84);
            auVar76 = vpunpckhdq_avx2(auVar76,auVar84);
            local_12e0 = vpblendd_avx2(auVar107,local_e80,0xcc);
            local_12c0 = vpsrldq_avx2(auVar107,8);
            local_12a0 = vpblendd_avx2(auVar76,local_e80,0xcc);
            local_1280 = vpsrldq_avx2(auVar76,8);
            lVar31 = 0;
            puVar32 = dst;
            do {
              *(undefined8 *)puVar32 = *(undefined8 *)(local_1460 + lVar31);
              lVar31 = lVar31 + 0x20;
              puVar32 = puVar32 + stride;
            } while (lVar31 != 0x200);
            puVar32 = dst + stride * 0x10;
            lVar31 = 0x10;
            do {
              *(undefined8 *)puVar32 = *(undefined8 *)(local_1460 + lVar31);
              lVar31 = lVar31 + 0x20;
              puVar32 = puVar32 + stride;
            } while (lVar31 != 0x210);
            return;
          }
          if (bw != 4) {
            return;
          }
          iVar36 = 0x13 << (bVar4 & 0x1f);
          uVar1 = left[iVar36];
          auVar44[1] = uVar1;
          auVar44[0] = uVar1;
          auVar44[2] = uVar1;
          auVar44[3] = uVar1;
          auVar44[4] = uVar1;
          auVar44[5] = uVar1;
          auVar44[6] = uVar1;
          auVar44[7] = uVar1;
          auVar44[8] = uVar1;
          auVar44[9] = uVar1;
          auVar44[10] = uVar1;
          auVar44[0xb] = uVar1;
          auVar44[0xc] = uVar1;
          auVar44[0xd] = uVar1;
          auVar44[0xe] = uVar1;
          auVar44[0xf] = uVar1;
          auVar61._8_2_ = 0x10;
          auVar61._0_8_ = 0x10001000100010;
          auVar61._10_2_ = 0x10;
          auVar61._12_2_ = 0x10;
          auVar61._14_2_ = 0x10;
          auVar61._16_2_ = 0x10;
          auVar61._18_2_ = 0x10;
          auVar61._20_2_ = 0x10;
          auVar61._22_2_ = 0x10;
          auVar61._24_2_ = 0x10;
          auVar61._26_2_ = 0x10;
          auVar61._28_2_ = 0x10;
          auVar61._30_2_ = 0x10;
          lVar31 = 0;
          auVar80._8_2_ = 0x1f;
          auVar80._0_8_ = 0x1f001f001f001f;
          auVar80._10_2_ = 0x1f;
          auVar80._12_2_ = 0x1f;
          auVar80._14_2_ = 0x1f;
          auVar80._16_2_ = 0x1f;
          auVar80._18_2_ = 0x1f;
          auVar80._20_2_ = 0x1f;
          auVar80._22_2_ = 0x1f;
          auVar80._24_2_ = 0x1f;
          auVar80._26_2_ = 0x1f;
          auVar80._28_2_ = 0x1f;
          auVar80._30_2_ = 0x1f;
          lVar34 = 0;
          uVar35 = dy;
          do {
            iVar40 = (int)uVar35 >> (6 - bVar4 & 0x1f);
            uVar37 = iVar36 - iVar40 >> (bVar4 & 0x1f);
            lVar38 = lVar31;
            if ((int)uVar37 < 1) {
              do {
                *(undefined1 (*) [16])(local_1460 + lVar38) = auVar44;
                lVar38 = lVar38 + 0x10;
              } while (lVar38 != 0x40);
            }
            else {
              uVar33 = 0x10;
              if ((int)uVar37 < 0x10) {
                uVar33 = uVar37;
              }
              auVar47 = *(undefined1 (*) [16])(left + iVar40);
              if (upsample_left == 0) {
                auVar93 = *(undefined1 (*) [16])(left + (long)iVar40 + 1);
                uVar3 = (ushort)(uVar35 >> 1);
                uVar72 = uVar3 & 0x1f;
                auVar101._0_8_ =
                     CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
                auVar101._8_2_ = uVar72;
                auVar101._10_2_ = uVar72;
                auVar101._12_2_ = uVar72;
                auVar101._14_2_ = uVar72;
                auVar101._16_2_ = uVar72;
                auVar101._18_2_ = uVar72;
                auVar101._20_2_ = uVar72;
                auVar101._22_2_ = uVar72;
                auVar101._24_2_ = uVar72;
                auVar101._26_2_ = uVar72;
                auVar101._28_2_ = uVar72;
                auVar101._30_2_ = uVar72;
              }
              else {
                auVar47 = vpshufb_avx(auVar47,_DAT_005109e0);
                auVar93 = vpsrldq_avx(auVar47,8);
                auVar100._0_2_ = (undefined2)uVar35;
                auVar100._2_2_ = auVar100._0_2_;
                auVar100._4_2_ = auVar100._0_2_;
                auVar100._6_2_ = auVar100._0_2_;
                auVar100._8_2_ = auVar100._0_2_;
                auVar100._10_2_ = auVar100._0_2_;
                auVar100._12_2_ = auVar100._0_2_;
                auVar100._14_2_ = auVar100._0_2_;
                auVar100._16_2_ = auVar100._0_2_;
                auVar100._18_2_ = auVar100._0_2_;
                auVar100._20_2_ = auVar100._0_2_;
                auVar100._22_2_ = auVar100._0_2_;
                auVar100._24_2_ = auVar100._0_2_;
                auVar100._26_2_ = auVar100._0_2_;
                auVar100._28_2_ = auVar100._0_2_;
                auVar100._30_2_ = auVar100._0_2_;
                auVar76 = vpsllw_avx2(auVar100,ZEXT416((uint)upsample_left));
                auVar76 = vpsrlw_avx2(auVar76,1);
                auVar101 = vpand_avx2(auVar76,auVar80);
              }
              auVar76 = vpmovzxbw_avx2(auVar47);
              auVar84 = vpmovzxbw_avx2(auVar93);
              auVar84 = vpsubw_avx2(auVar84,auVar76);
              auVar84 = vpmullw_avx2(auVar84,auVar101);
              auVar76 = vpsllw_avx2(auVar76,5);
              auVar76 = vpaddw_avx2(auVar76,auVar61);
              auVar76 = vpaddw_avx2(auVar84,auVar76);
              auVar76 = vpsrlw_avx2(auVar76,5);
              auVar47 = vpackuswb_avx(auVar76._0_16_,auVar76._16_16_);
              auVar47 = vpblendvb_avx(auVar44,auVar47,*(undefined1 (*) [16])BaseMask[uVar33]);
              *(undefined1 (*) [16])(local_1460 + lVar34 * 0x10) = auVar47;
              uVar35 = uVar35 + dy;
            }
            if ((int)uVar37 < 1) break;
            lVar34 = lVar34 + 1;
            lVar31 = lVar31 + 0x10;
          } while (lVar34 != 4);
          auVar92 = vpunpcklbw_avx(local_1460._0_16_,stack0xffffffffffffebb0);
          auVar46 = vpunpcklbw_avx(local_1440._0_16_,local_1440._16_16_);
          auVar47 = vpunpckhbw_avx(local_1460._0_16_,stack0xffffffffffffebb0);
          auVar93 = vpunpckhbw_avx(local_1440._0_16_,local_1440._16_16_);
          auVar51 = vpunpcklwd_avx(auVar92,auVar46);
          auVar53 = vpunpcklwd_avx(auVar47,auVar93);
          auVar92 = vpunpckhwd_avx(auVar92,auVar46);
          auVar47 = vpunpckhwd_avx(auVar47,auVar93);
          auVar46 = vpunpckldq_avx(auVar51,auVar53);
          auVar42 = vpunpckldq_avx(auVar92,auVar47);
          auVar93 = vpunpckhdq_avx(auVar51,auVar53);
          auVar47 = vpunpckhdq_avx(auVar92,auVar47);
          local_1060 = vpunpcklqdq_avx(auVar46,auVar42);
          auStack_1050 = vpunpckhqdq_avx(auVar46,auVar42);
          local_1040 = vpunpcklqdq_avx(auVar93,auVar47);
          auStack_1030 = vpunpckhqdq_avx(auVar93,auVar47);
          local_1020 = vpsrldq_avx(local_1060,8);
          auStack_1010 = vpsrldq_avx(auStack_1050,8);
          local_1000 = vpsrldq_avx(local_1040,8);
          auStack_ff0 = vpsrldq_avx(auStack_1030,8);
          local_fe0 = vpsrldq_avx(local_1060,4);
          auStack_fd0 = vpsrldq_avx(auStack_1050,4);
          local_fc0 = vpsrldq_avx(local_1040,4);
          auStack_fb0 = vpsrldq_avx(auStack_1030,4);
          local_fa0 = vpsrldq_avx(local_1060,0xc);
          auStack_f90 = vpsrldq_avx(auStack_1050,0xc);
          local_f80 = vpsrldq_avx(local_1040,0xc);
          auStack_f70 = vpsrldq_avx(auStack_1030,0xc);
          lVar31 = 0;
          do {
            *(undefined4 *)dst = *(undefined4 *)(local_1060 + lVar31);
            lVar31 = lVar31 + 0x10;
            dst = dst + stride;
          } while (lVar31 != 0x100);
          return;
        }
        uStack_1608 = 0x359886;
        dr_prediction_z1_64xN_avx2(0x10,local_1060,0x40,left,dy,iVar36);
        iVar36 = 0x10;
      }
      goto LAB_0035aafb;
    }
    if (bh * 2 != bw) {
      if (bh == 0x10) {
        iVar36 = 0x4f << (bVar4 & 0x1f);
        uVar1 = left[iVar36];
        auVar50[1] = uVar1;
        auVar50[0] = uVar1;
        auVar50[2] = uVar1;
        auVar50[3] = uVar1;
        auVar50[4] = uVar1;
        auVar50[5] = uVar1;
        auVar50[6] = uVar1;
        auVar50[7] = uVar1;
        auVar50[8] = uVar1;
        auVar50[9] = uVar1;
        auVar50[10] = uVar1;
        auVar50[0xb] = uVar1;
        auVar50[0xc] = uVar1;
        auVar50[0xd] = uVar1;
        auVar50[0xe] = uVar1;
        auVar50[0xf] = uVar1;
        auVar67._8_2_ = 0x10;
        auVar67._0_8_ = 0x10001000100010;
        auVar67._10_2_ = 0x10;
        auVar67._12_2_ = 0x10;
        auVar67._14_2_ = 0x10;
        auVar67._16_2_ = 0x10;
        auVar67._18_2_ = 0x10;
        auVar67._20_2_ = 0x10;
        auVar67._22_2_ = 0x10;
        auVar67._24_2_ = 0x10;
        auVar67._26_2_ = 0x10;
        auVar67._28_2_ = 0x10;
        auVar67._30_2_ = 0x10;
        lVar31 = 0;
        auVar87._8_2_ = 0x1f;
        auVar87._0_8_ = 0x1f001f001f001f;
        auVar87._10_2_ = 0x1f;
        auVar87._12_2_ = 0x1f;
        auVar87._14_2_ = 0x1f;
        auVar87._16_2_ = 0x1f;
        auVar87._18_2_ = 0x1f;
        auVar87._20_2_ = 0x1f;
        auVar87._22_2_ = 0x1f;
        auVar87._24_2_ = 0x1f;
        auVar87._26_2_ = 0x1f;
        auVar87._28_2_ = 0x1f;
        auVar87._30_2_ = 0x1f;
        lVar34 = 0;
        uVar35 = dy;
        do {
          iVar40 = (int)uVar35 >> (6 - bVar4 & 0x1f);
          uVar37 = iVar36 - iVar40 >> (bVar4 & 0x1f);
          lVar38 = lVar31;
          if ((int)uVar37 < 1) {
            do {
              *(undefined1 (*) [16])(local_1060 + lVar38) = auVar50;
              lVar38 = lVar38 + 0x10;
            } while (lVar38 != 0x400);
          }
          else {
            uVar33 = 0x10;
            if ((int)uVar37 < 0x10) {
              uVar33 = uVar37;
            }
            auVar47 = *(undefined1 (*) [16])(left + iVar40);
            if (upsample_left == 0) {
              auVar93 = *(undefined1 (*) [16])(left + (long)iVar40 + 1);
              uVar3 = (ushort)(uVar35 >> 1);
              uVar72 = uVar3 & 0x1f;
              auVar111._0_8_ =
                   CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
              auVar111._8_2_ = uVar72;
              auVar111._10_2_ = uVar72;
              auVar111._12_2_ = uVar72;
              auVar111._14_2_ = uVar72;
              auVar111._16_2_ = uVar72;
              auVar111._18_2_ = uVar72;
              auVar111._20_2_ = uVar72;
              auVar111._22_2_ = uVar72;
              auVar111._24_2_ = uVar72;
              auVar111._26_2_ = uVar72;
              auVar111._28_2_ = uVar72;
              auVar111._30_2_ = uVar72;
            }
            else {
              auVar47 = vpshufb_avx(auVar47,_DAT_005109e0);
              auVar93 = vpsrldq_avx(auVar47,8);
              auVar110._0_2_ = (undefined2)uVar35;
              auVar110._2_2_ = auVar110._0_2_;
              auVar110._4_2_ = auVar110._0_2_;
              auVar110._6_2_ = auVar110._0_2_;
              auVar110._8_2_ = auVar110._0_2_;
              auVar110._10_2_ = auVar110._0_2_;
              auVar110._12_2_ = auVar110._0_2_;
              auVar110._14_2_ = auVar110._0_2_;
              auVar110._16_2_ = auVar110._0_2_;
              auVar110._18_2_ = auVar110._0_2_;
              auVar110._20_2_ = auVar110._0_2_;
              auVar110._22_2_ = auVar110._0_2_;
              auVar110._24_2_ = auVar110._0_2_;
              auVar110._26_2_ = auVar110._0_2_;
              auVar110._28_2_ = auVar110._0_2_;
              auVar110._30_2_ = auVar110._0_2_;
              auVar76 = vpsllw_avx2(auVar110,ZEXT416((uint)upsample_left));
              auVar76 = vpsrlw_avx2(auVar76,1);
              auVar111 = vpand_avx2(auVar76,auVar87);
            }
            auVar76 = vpmovzxbw_avx2(auVar47);
            auVar84 = vpmovzxbw_avx2(auVar93);
            auVar84 = vpsubw_avx2(auVar84,auVar76);
            auVar84 = vpmullw_avx2(auVar84,auVar111);
            auVar76 = vpsllw_avx2(auVar76,5);
            auVar76 = vpaddw_avx2(auVar76,auVar67);
            auVar76 = vpaddw_avx2(auVar84,auVar76);
            auVar76 = vpsrlw_avx2(auVar76,5);
            auVar47 = vpackuswb_avx(auVar76._0_16_,auVar76._16_16_);
            auVar47 = vpblendvb_avx(auVar50,auVar47,*(undefined1 (*) [16])BaseMask[uVar33]);
            *(undefined1 (*) [16])(local_1060 + lVar34 * 0x10) = auVar47;
            uVar35 = uVar35 + dy;
          }
          if ((int)uVar37 < 1) break;
          lVar34 = lVar34 + 1;
          lVar31 = lVar31 + 0x10;
        } while (lVar34 != 0x40);
        uVar39 = 0;
        do {
          lVar31 = uVar39 * 0x10;
          auVar92 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_1060 + lVar31),
                                   *(undefined1 (*) [16])(auStack_1050 + lVar31));
          auVar46 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_1040 + lVar31),
                                   *(undefined1 (*) [16])(auStack_1030 + lVar31));
          auVar51 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_1020 + lVar31),
                                   *(undefined1 (*) [16])(auStack_1010 + lVar31));
          auVar53 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_1000 + lVar31),
                                   *(undefined1 (*) [16])(auStack_ff0 + lVar31));
          auVar47 = vpunpcklwd_avx(auVar92,auVar46);
          auVar93 = vpunpcklwd_avx(auVar51,auVar53);
          auVar45 = vpunpckldq_avx(auVar47,auVar93);
          auVar47 = vpunpckhdq_avx(auVar47,auVar93);
          auVar42 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_fe0 + lVar31),
                                   *(undefined1 (*) [16])(auStack_fd0 + lVar31));
          auVar48 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_fc0 + lVar31),
                                   *(undefined1 (*) [16])(auStack_fb0 + lVar31));
          auVar44 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_fa0 + lVar31),
                                   *(undefined1 (*) [16])(auStack_f90 + lVar31));
          auVar50 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_f80 + lVar31),
                                   *(undefined1 (*) [16])(auStack_f70 + lVar31));
          auVar93 = vpunpcklwd_avx(auVar42,auVar48);
          auVar49 = vpunpcklwd_avx(auVar44,auVar50);
          auVar52 = vpunpckldq_avx(auVar93,auVar49);
          auVar93 = vpunpckhdq_avx(auVar93,auVar49);
          local_1460._0_16_ = vpunpcklqdq_avx(auVar45,auVar52);
          unique0x00102d80 = vpunpckhqdq_avx(auVar45,auVar52);
          local_1440._0_16_ = vpunpcklqdq_avx(auVar47,auVar93);
          local_1440._16_16_ = vpunpckhqdq_avx(auVar47,auVar93);
          auVar47 = vpunpckhwd_avx(auVar92,auVar46);
          auVar93 = vpunpckhwd_avx(auVar51,auVar53);
          auVar92 = vpunpckhwd_avx(auVar42,auVar48);
          auVar46 = vpunpckhwd_avx(auVar44,auVar50);
          auVar51 = vpunpckldq_avx(auVar47,auVar93);
          auVar47 = vpunpckhdq_avx(auVar47,auVar93);
          auVar53 = vpunpckldq_avx(auVar92,auVar46);
          auVar93 = vpunpckhdq_avx(auVar92,auVar46);
          local_1420._0_16_ = vpunpcklqdq_avx(auVar51,auVar53);
          local_1420._16_16_ = vpunpckhqdq_avx(auVar51,auVar53);
          local_1400._0_16_ = vpunpcklqdq_avx(auVar47,auVar93);
          local_1400._16_16_ = vpunpckhqdq_avx(auVar47,auVar93);
          auVar47 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_1060 + lVar31),
                                   *(undefined1 (*) [16])(auStack_1050 + lVar31));
          auVar93 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_1040 + lVar31),
                                   *(undefined1 (*) [16])(auStack_1030 + lVar31));
          auVar92 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_1020 + lVar31),
                                   *(undefined1 (*) [16])(auStack_1010 + lVar31));
          auVar46 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_1000 + lVar31),
                                   *(undefined1 (*) [16])(auStack_ff0 + lVar31));
          auVar51 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_fe0 + lVar31),
                                   *(undefined1 (*) [16])(auStack_fd0 + lVar31));
          auVar53 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_fc0 + lVar31),
                                   *(undefined1 (*) [16])(auStack_fb0 + lVar31));
          auVar42 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_fa0 + lVar31),
                                   *(undefined1 (*) [16])(auStack_f90 + lVar31));
          auVar48 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_f80 + lVar31),
                                   *(undefined1 (*) [16])(auStack_f70 + lVar31));
          auVar44 = vpunpcklwd_avx(auVar47,auVar93);
          auVar50 = vpunpcklwd_avx(auVar92,auVar46);
          auVar49 = vpunpcklwd_avx(auVar51,auVar53);
          auVar45 = vpunpcklwd_avx(auVar42,auVar48);
          auVar52 = vpunpckldq_avx(auVar44,auVar50);
          auVar44 = vpunpckhdq_avx(auVar44,auVar50);
          auVar54 = vpunpckldq_avx(auVar49,auVar45);
          auVar50 = vpunpckhdq_avx(auVar49,auVar45);
          local_13e0._0_16_ = vpunpcklqdq_avx(auVar52,auVar54);
          local_13e0._16_16_ = vpunpckhqdq_avx(auVar52,auVar54);
          local_13c0._0_16_ = vpunpcklqdq_avx(auVar44,auVar50);
          local_13c0._16_16_ = vpunpckhqdq_avx(auVar44,auVar50);
          auVar47 = vpunpckhwd_avx(auVar47,auVar93);
          auVar93 = vpunpckhwd_avx(auVar92,auVar46);
          auVar92 = vpunpckhwd_avx(auVar51,auVar53);
          auVar46 = vpunpckhwd_avx(auVar42,auVar48);
          auVar51 = vpunpckldq_avx(auVar47,auVar93);
          auVar47 = vpunpckhdq_avx(auVar47,auVar93);
          auVar53 = vpunpckldq_avx(auVar92,auVar46);
          auVar93 = vpunpckhdq_avx(auVar92,auVar46);
          local_13a0._0_16_ = vpunpcklqdq_avx(auVar51,auVar53);
          local_13a0._16_16_ = vpunpckhqdq_avx(auVar51,auVar53);
          local_1380._0_16_ = vpunpcklqdq_avx(auVar47,auVar93);
          local_1380._16_16_ = vpunpckhqdq_avx(auVar47,auVar93);
          lVar31 = 0;
          puVar32 = dst;
          do {
            uVar2 = *(undefined8 *)(local_1460 + lVar31 + 8);
            *(undefined8 *)puVar32 = *(undefined8 *)(local_1460 + lVar31);
            *(undefined8 *)(puVar32 + 8) = uVar2;
            lVar31 = lVar31 + 0x10;
            puVar32 = puVar32 + stride;
          } while (lVar31 != 0x100);
          dst = dst + 0x10;
          bVar41 = uVar39 < 0x30;
          uVar39 = uVar39 + 0x10;
        } while (bVar41);
        return;
      }
      if (bh == 8) {
        iVar36 = 0x27 << (bVar4 & 0x1f);
        uVar1 = left[iVar36];
        auVar49[1] = uVar1;
        auVar49[0] = uVar1;
        auVar49[2] = uVar1;
        auVar49[3] = uVar1;
        auVar49[4] = uVar1;
        auVar49[5] = uVar1;
        auVar49[6] = uVar1;
        auVar49[7] = uVar1;
        auVar49[8] = uVar1;
        auVar49[9] = uVar1;
        auVar49[10] = uVar1;
        auVar49[0xb] = uVar1;
        auVar49[0xc] = uVar1;
        auVar49[0xd] = uVar1;
        auVar49[0xe] = uVar1;
        auVar49[0xf] = uVar1;
        auVar66._8_2_ = 0x10;
        auVar66._0_8_ = 0x10001000100010;
        auVar66._10_2_ = 0x10;
        auVar66._12_2_ = 0x10;
        auVar66._14_2_ = 0x10;
        auVar66._16_2_ = 0x10;
        auVar66._18_2_ = 0x10;
        auVar66._20_2_ = 0x10;
        auVar66._22_2_ = 0x10;
        auVar66._24_2_ = 0x10;
        auVar66._26_2_ = 0x10;
        auVar66._28_2_ = 0x10;
        auVar66._30_2_ = 0x10;
        lVar31 = 0;
        auVar86._8_2_ = 0x1f;
        auVar86._0_8_ = 0x1f001f001f001f;
        auVar86._10_2_ = 0x1f;
        auVar86._12_2_ = 0x1f;
        auVar86._14_2_ = 0x1f;
        auVar86._16_2_ = 0x1f;
        auVar86._18_2_ = 0x1f;
        auVar86._20_2_ = 0x1f;
        auVar86._22_2_ = 0x1f;
        auVar86._24_2_ = 0x1f;
        auVar86._26_2_ = 0x1f;
        auVar86._28_2_ = 0x1f;
        auVar86._30_2_ = 0x1f;
        lVar34 = 0;
        uVar35 = dy;
        do {
          iVar40 = (int)uVar35 >> (6 - bVar4 & 0x1f);
          uVar37 = iVar36 - iVar40 >> (bVar4 & 0x1f);
          lVar38 = lVar31;
          if ((int)uVar37 < 1) {
            do {
              *(undefined1 (*) [16])(local_1060 + lVar38) = auVar49;
              lVar38 = lVar38 + 0x10;
            } while (lVar38 != 0x200);
          }
          else {
            uVar33 = 8;
            if ((int)uVar37 < 8) {
              uVar33 = uVar37;
            }
            auVar47 = *(undefined1 (*) [16])(left + iVar40);
            if (upsample_left == 0) {
              auVar93 = *(undefined1 (*) [16])(left + (long)iVar40 + 1);
              uVar3 = (ushort)(uVar35 >> 1);
              uVar72 = uVar3 & 0x1f;
              auVar109._0_8_ =
                   CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
              auVar109._8_2_ = uVar72;
              auVar109._10_2_ = uVar72;
              auVar109._12_2_ = uVar72;
              auVar109._14_2_ = uVar72;
              auVar109._16_2_ = uVar72;
              auVar109._18_2_ = uVar72;
              auVar109._20_2_ = uVar72;
              auVar109._22_2_ = uVar72;
              auVar109._24_2_ = uVar72;
              auVar109._26_2_ = uVar72;
              auVar109._28_2_ = uVar72;
              auVar109._30_2_ = uVar72;
            }
            else {
              auVar47 = vpshufb_avx(auVar47,_DAT_005109e0);
              auVar93 = vpsrldq_avx(auVar47,8);
              auVar108._0_2_ = (undefined2)uVar35;
              auVar108._2_2_ = auVar108._0_2_;
              auVar108._4_2_ = auVar108._0_2_;
              auVar108._6_2_ = auVar108._0_2_;
              auVar108._8_2_ = auVar108._0_2_;
              auVar108._10_2_ = auVar108._0_2_;
              auVar108._12_2_ = auVar108._0_2_;
              auVar108._14_2_ = auVar108._0_2_;
              auVar108._16_2_ = auVar108._0_2_;
              auVar108._18_2_ = auVar108._0_2_;
              auVar108._20_2_ = auVar108._0_2_;
              auVar108._22_2_ = auVar108._0_2_;
              auVar108._24_2_ = auVar108._0_2_;
              auVar108._26_2_ = auVar108._0_2_;
              auVar108._28_2_ = auVar108._0_2_;
              auVar108._30_2_ = auVar108._0_2_;
              auVar76 = vpsllw_avx2(auVar108,ZEXT416((uint)upsample_left));
              auVar76 = vpsrlw_avx2(auVar76,1);
              auVar109 = vpand_avx2(auVar76,auVar86);
            }
            auVar76 = vpmovzxbw_avx2(auVar47);
            auVar84 = vpmovzxbw_avx2(auVar93);
            auVar84 = vpsubw_avx2(auVar84,auVar76);
            auVar84 = vpmullw_avx2(auVar84,auVar109);
            auVar76 = vpsllw_avx2(auVar76,5);
            auVar76 = vpaddw_avx2(auVar76,auVar66);
            auVar76 = vpaddw_avx2(auVar84,auVar76);
            auVar76 = vpsrlw_avx2(auVar76,5);
            auVar47 = vpackuswb_avx(auVar76._0_16_,auVar76._16_16_);
            auVar47 = vpblendvb_avx(auVar49,auVar47,*(undefined1 (*) [16])BaseMask[uVar33]);
            *(undefined1 (*) [16])(local_1060 + lVar34 * 0x10) = auVar47;
            uVar35 = uVar35 + dy;
          }
          if ((int)uVar37 < 1) break;
          lVar34 = lVar34 + 1;
          lVar31 = lVar31 + 0x10;
        } while (lVar34 != 0x20);
        auVar92 = vpunpcklbw_avx(local_1060,auStack_1050);
        auVar46 = vpunpcklbw_avx(local_1040,auStack_1030);
        auVar51 = vpunpcklbw_avx(local_1020,auStack_1010);
        auVar53 = vpunpcklbw_avx(local_1000,auStack_ff0);
        auVar42 = vpunpcklbw_avx(local_fe0,auStack_fd0);
        auVar48 = vpunpcklbw_avx(local_fc0,auStack_fb0);
        auVar44 = vpunpcklbw_avx(local_fa0,auStack_f90);
        auVar50 = vpunpcklbw_avx(local_f80,auStack_f70);
        auVar47 = vpunpcklwd_avx(auVar92,auVar46);
        auVar93 = vpunpcklwd_avx(auVar51,auVar53);
        auVar49 = vpunpcklwd_avx(auVar42,auVar48);
        auVar45 = vpunpcklwd_avx(auVar44,auVar50);
        auVar52 = vpunpckldq_avx(auVar47,auVar93);
        auVar47 = vpunpckhdq_avx(auVar47,auVar93);
        auVar54 = vpunpckldq_avx(auVar49,auVar45);
        auVar93 = vpunpckhdq_avx(auVar49,auVar45);
        local_1460._0_16_ = vpunpcklqdq_avx(auVar52,auVar54);
        unique0x00102d80 = vpunpckhqdq_avx(auVar52,auVar54);
        local_1440._0_16_ = vpunpcklqdq_avx(auVar47,auVar93);
        local_1440._16_16_ = vpunpckhqdq_avx(auVar47,auVar93);
        auVar47 = vpunpckhwd_avx(auVar92,auVar46);
        auVar93 = vpunpckhwd_avx(auVar51,auVar53);
        auVar92 = vpunpckhwd_avx(auVar42,auVar48);
        auVar46 = vpunpckhwd_avx(auVar44,auVar50);
        auVar51 = vpunpckldq_avx(auVar47,auVar93);
        auVar47 = vpunpckhdq_avx(auVar47,auVar93);
        auVar53 = vpunpckldq_avx(auVar92,auVar46);
        auVar93 = vpunpckhdq_avx(auVar92,auVar46);
        local_1420._0_16_ = vpunpcklqdq_avx(auVar51,auVar53);
        local_1420._16_16_ = vpunpckhqdq_avx(auVar51,auVar53);
        local_1400._0_16_ = vpunpcklqdq_avx(auVar47,auVar93);
        auVar92 = vpunpcklbw_avx(local_f60._0_16_,local_f60._16_16_);
        auVar46 = vpunpcklbw_avx(local_f40._0_16_,local_f40._16_16_);
        auVar51 = vpunpcklbw_avx(local_f20._0_16_,local_f20._16_16_);
        auVar53 = vpunpcklbw_avx(local_f00._0_16_,local_f00._16_16_);
        local_1400._16_16_ = vpunpckhqdq_avx(auVar47,auVar93);
        auVar42 = vpunpcklbw_avx(local_ee0._0_16_,local_ee0._16_16_);
        auVar48 = vpunpcklbw_avx(local_ec0._0_16_,local_ec0._16_16_);
        auVar44 = vpunpcklbw_avx(local_ea0._0_16_,local_ea0._16_16_);
        auVar50 = vpunpcklbw_avx(local_e80._0_16_,local_e80._16_16_);
        auVar47 = vpunpcklwd_avx(auVar92,auVar46);
        auVar93 = vpunpcklwd_avx(auVar51,auVar53);
        auVar49 = vpunpcklwd_avx(auVar42,auVar48);
        auVar45 = vpunpcklwd_avx(auVar44,auVar50);
        auVar52 = vpunpckldq_avx(auVar47,auVar93);
        auVar47 = vpunpckhdq_avx(auVar47,auVar93);
        auVar54 = vpunpckldq_avx(auVar49,auVar45);
        auVar93 = vpunpckhdq_avx(auVar49,auVar45);
        local_13e0._0_16_ = vpunpcklqdq_avx(auVar52,auVar54);
        local_13e0._16_16_ = vpunpckhqdq_avx(auVar52,auVar54);
        local_13c0._0_16_ = vpunpcklqdq_avx(auVar47,auVar93);
        local_13c0._16_16_ = vpunpckhqdq_avx(auVar47,auVar93);
        auVar47 = vpunpckhwd_avx(auVar92,auVar46);
        auVar93 = vpunpckhwd_avx(auVar51,auVar53);
        auVar92 = vpunpckhwd_avx(auVar42,auVar48);
        auVar46 = vpunpckhwd_avx(auVar44,auVar50);
        auVar51 = vpunpckldq_avx(auVar47,auVar93);
        auVar47 = vpunpckhdq_avx(auVar47,auVar93);
        auVar53 = vpunpckldq_avx(auVar92,auVar46);
        auVar93 = vpunpckhdq_avx(auVar92,auVar46);
        local_13a0._0_16_ = vpunpcklqdq_avx(auVar51,auVar53);
        local_13a0._16_16_ = vpunpckhqdq_avx(auVar51,auVar53);
        local_1380._0_16_ = vpunpcklqdq_avx(auVar47,auVar93);
        local_1380._16_16_ = vpunpckhqdq_avx(auVar47,auVar93);
        puVar32 = dst + 0x10;
        lVar31 = 0x80;
        do {
          uVar2 = *(undefined8 *)((long)local_14e0 + lVar31 + 8);
          *(undefined8 *)(puVar32 + -0x10) = *(undefined8 *)((long)local_14e0 + lVar31);
          *(undefined8 *)(puVar32 + -8) = uVar2;
          uVar2 = *(undefined8 *)(local_1460 + lVar31 + 8);
          *(undefined8 *)puVar32 = *(undefined8 *)(local_1460 + lVar31);
          *(undefined8 *)(puVar32 + 8) = uVar2;
          lVar31 = lVar31 + 0x10;
          puVar32 = puVar32 + stride;
        } while (lVar31 != 0x100);
        return;
      }
      if (bh != 4) {
        return;
      }
      iVar36 = 0x13 << (bVar4 & 0x1f);
      uVar1 = left[iVar36];
      auVar45[1] = uVar1;
      auVar45[0] = uVar1;
      auVar45[2] = uVar1;
      auVar45[3] = uVar1;
      auVar45[4] = uVar1;
      auVar45[5] = uVar1;
      auVar45[6] = uVar1;
      auVar45[7] = uVar1;
      auVar45[8] = uVar1;
      auVar45[9] = uVar1;
      auVar45[10] = uVar1;
      auVar45[0xb] = uVar1;
      auVar45[0xc] = uVar1;
      auVar45[0xd] = uVar1;
      auVar45[0xe] = uVar1;
      auVar45[0xf] = uVar1;
      auVar62._8_2_ = 0x10;
      auVar62._0_8_ = 0x10001000100010;
      auVar62._10_2_ = 0x10;
      auVar62._12_2_ = 0x10;
      auVar62._14_2_ = 0x10;
      auVar62._16_2_ = 0x10;
      auVar62._18_2_ = 0x10;
      auVar62._20_2_ = 0x10;
      auVar62._22_2_ = 0x10;
      auVar62._24_2_ = 0x10;
      auVar62._26_2_ = 0x10;
      auVar62._28_2_ = 0x10;
      auVar62._30_2_ = 0x10;
      lVar31 = 0;
      auVar81._8_2_ = 0x1f;
      auVar81._0_8_ = 0x1f001f001f001f;
      auVar81._10_2_ = 0x1f;
      auVar81._12_2_ = 0x1f;
      auVar81._14_2_ = 0x1f;
      auVar81._16_2_ = 0x1f;
      auVar81._18_2_ = 0x1f;
      auVar81._20_2_ = 0x1f;
      auVar81._22_2_ = 0x1f;
      auVar81._24_2_ = 0x1f;
      auVar81._26_2_ = 0x1f;
      auVar81._28_2_ = 0x1f;
      auVar81._30_2_ = 0x1f;
      lVar34 = 0;
      uVar35 = dy;
      do {
        iVar40 = (int)uVar35 >> (6 - bVar4 & 0x1f);
        uVar37 = iVar36 - iVar40 >> (bVar4 & 0x1f);
        lVar38 = lVar31;
        if ((int)uVar37 < 1) {
          do {
            *(undefined1 (*) [16])(local_1060 + lVar38) = auVar45;
            lVar38 = lVar38 + 0x10;
          } while (lVar38 != 0x100);
        }
        else {
          uVar33 = 4;
          if ((int)uVar37 < 4) {
            uVar33 = uVar37;
          }
          auVar47 = *(undefined1 (*) [16])(left + iVar40);
          if (upsample_left == 0) {
            auVar93 = *(undefined1 (*) [16])(left + (long)iVar40 + 1);
            uVar3 = (ushort)(uVar35 >> 1);
            uVar72 = uVar3 & 0x1f;
            auVar103._0_8_ =
                 CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
            auVar103._8_2_ = uVar72;
            auVar103._10_2_ = uVar72;
            auVar103._12_2_ = uVar72;
            auVar103._14_2_ = uVar72;
            auVar103._16_2_ = uVar72;
            auVar103._18_2_ = uVar72;
            auVar103._20_2_ = uVar72;
            auVar103._22_2_ = uVar72;
            auVar103._24_2_ = uVar72;
            auVar103._26_2_ = uVar72;
            auVar103._28_2_ = uVar72;
            auVar103._30_2_ = uVar72;
          }
          else {
            auVar47 = vpshufb_avx(auVar47,_DAT_005109e0);
            auVar93 = vpsrldq_avx(auVar47,8);
            auVar102._0_2_ = (undefined2)uVar35;
            auVar102._2_2_ = auVar102._0_2_;
            auVar102._4_2_ = auVar102._0_2_;
            auVar102._6_2_ = auVar102._0_2_;
            auVar102._8_2_ = auVar102._0_2_;
            auVar102._10_2_ = auVar102._0_2_;
            auVar102._12_2_ = auVar102._0_2_;
            auVar102._14_2_ = auVar102._0_2_;
            auVar102._16_2_ = auVar102._0_2_;
            auVar102._18_2_ = auVar102._0_2_;
            auVar102._20_2_ = auVar102._0_2_;
            auVar102._22_2_ = auVar102._0_2_;
            auVar102._24_2_ = auVar102._0_2_;
            auVar102._26_2_ = auVar102._0_2_;
            auVar102._28_2_ = auVar102._0_2_;
            auVar102._30_2_ = auVar102._0_2_;
            auVar76 = vpsllw_avx2(auVar102,ZEXT416((uint)upsample_left));
            auVar76 = vpsrlw_avx2(auVar76,1);
            auVar103 = vpand_avx2(auVar76,auVar81);
          }
          auVar76 = vpmovzxbw_avx2(auVar47);
          auVar84 = vpmovzxbw_avx2(auVar93);
          auVar84 = vpsubw_avx2(auVar84,auVar76);
          auVar84 = vpmullw_avx2(auVar84,auVar103);
          auVar76 = vpsllw_avx2(auVar76,5);
          auVar76 = vpaddw_avx2(auVar76,auVar62);
          auVar76 = vpaddw_avx2(auVar84,auVar76);
          auVar76 = vpsrlw_avx2(auVar76,5);
          auVar47 = vpackuswb_avx(auVar76._0_16_,auVar76._16_16_);
          auVar47 = vpblendvb_avx(auVar45,auVar47,*(undefined1 (*) [16])BaseMask[uVar33]);
          *(undefined1 (*) [16])(local_1060 + lVar34 * 0x10) = auVar47;
          uVar35 = uVar35 + dy;
        }
        if ((int)uVar37 < 1) break;
        lVar34 = lVar34 + 1;
        lVar31 = lVar31 + 0x10;
      } while (lVar34 != 0x10);
      auVar92 = vpunpcklbw_avx(local_1060,auStack_1050);
      auVar46 = vpunpcklbw_avx(local_1040,auStack_1030);
      auVar51 = vpunpcklbw_avx(local_1020,auStack_1010);
      auVar53 = vpunpcklbw_avx(local_1000,auStack_ff0);
      auVar42 = vpunpcklbw_avx(local_fe0,auStack_fd0);
      auVar48 = vpunpcklbw_avx(local_fc0,auStack_fb0);
      auVar44 = vpunpcklbw_avx(local_fa0,auStack_f90);
      auVar50 = vpunpcklbw_avx(local_f80,auStack_f70);
      auVar47 = vpunpcklwd_avx(auVar92,auVar46);
      auVar93 = vpunpcklwd_avx(auVar51,auVar53);
      auVar49 = vpunpcklwd_avx(auVar42,auVar48);
      auVar45 = vpunpcklwd_avx(auVar44,auVar50);
      auVar52 = vpunpckldq_avx(auVar47,auVar93);
      auVar47 = vpunpckhdq_avx(auVar47,auVar93);
      auVar54 = vpunpckldq_avx(auVar49,auVar45);
      auVar93 = vpunpckhdq_avx(auVar49,auVar45);
      local_1460._0_16_ = vpunpcklqdq_avx(auVar52,auVar54);
      unique0x00102d80 = vpunpckhqdq_avx(auVar52,auVar54);
      local_1440._0_16_ = vpunpcklqdq_avx(auVar47,auVar93);
      local_1440._16_16_ = vpunpckhqdq_avx(auVar47,auVar93);
      auVar47 = vpunpckhwd_avx(auVar92,auVar46);
      auVar93 = vpunpckhwd_avx(auVar51,auVar53);
      auVar92 = vpunpckhwd_avx(auVar42,auVar48);
      auVar46 = vpunpckhwd_avx(auVar44,auVar50);
      auVar51 = vpunpckldq_avx(auVar47,auVar93);
      auVar47 = vpunpckhdq_avx(auVar47,auVar93);
      auVar53 = vpunpckldq_avx(auVar92,auVar46);
      auVar93 = vpunpckhdq_avx(auVar92,auVar46);
      local_1420._0_16_ = vpunpcklqdq_avx(auVar51,auVar53);
      local_1420._16_16_ = vpunpckhqdq_avx(auVar51,auVar53);
      local_1400._0_16_ = vpunpcklqdq_avx(auVar47,auVar93);
      local_1400._16_16_ = vpunpckhqdq_avx(auVar47,auVar93);
      lVar31 = 0;
      do {
        uVar2 = *(undefined8 *)(local_1460 + lVar31 + 8);
        *(undefined8 *)dst = *(undefined8 *)(local_1460 + lVar31);
        *(undefined8 *)(dst + 8) = uVar2;
        lVar31 = lVar31 + 0x10;
        dst = dst + stride;
      } while (lVar31 != 0x40);
      return;
    }
    switch(bh << 0x1e | bh - 4U >> 2) {
    case 0:
      iVar36 = 0xb << (bVar4 & 0x1f);
      uVar1 = left[iVar36];
      auVar43[1] = uVar1;
      auVar43[0] = uVar1;
      auVar43[2] = uVar1;
      auVar43[3] = uVar1;
      auVar43[4] = uVar1;
      auVar43[5] = uVar1;
      auVar43[6] = uVar1;
      auVar43[7] = uVar1;
      auVar43[8] = uVar1;
      auVar43[9] = uVar1;
      auVar43[10] = uVar1;
      auVar43[0xb] = uVar1;
      auVar43[0xc] = uVar1;
      auVar43[0xd] = uVar1;
      auVar43[0xe] = uVar1;
      auVar43[0xf] = uVar1;
      auVar59._8_2_ = 0x10;
      auVar59._0_8_ = 0x10001000100010;
      auVar59._10_2_ = 0x10;
      auVar59._12_2_ = 0x10;
      auVar59._14_2_ = 0x10;
      auVar59._16_2_ = 0x10;
      auVar59._18_2_ = 0x10;
      auVar59._20_2_ = 0x10;
      auVar59._22_2_ = 0x10;
      auVar59._24_2_ = 0x10;
      auVar59._26_2_ = 0x10;
      auVar59._28_2_ = 0x10;
      auVar59._30_2_ = 0x10;
      lVar31 = 0;
      auVar78._8_2_ = 0x1f;
      auVar78._0_8_ = 0x1f001f001f001f;
      auVar78._10_2_ = 0x1f;
      auVar78._12_2_ = 0x1f;
      auVar78._14_2_ = 0x1f;
      auVar78._16_2_ = 0x1f;
      auVar78._18_2_ = 0x1f;
      auVar78._20_2_ = 0x1f;
      auVar78._22_2_ = 0x1f;
      auVar78._24_2_ = 0x1f;
      auVar78._26_2_ = 0x1f;
      auVar78._28_2_ = 0x1f;
      auVar78._30_2_ = 0x1f;
      lVar34 = 0;
      uVar35 = dy;
      do {
        iVar40 = (int)uVar35 >> (6 - bVar4 & 0x1f);
        uVar37 = iVar36 - iVar40 >> (bVar4 & 0x1f);
        lVar38 = lVar31;
        if ((int)uVar37 < 1) {
          do {
            *(undefined1 (*) [16])(local_1060 + lVar38) = auVar43;
            lVar38 = lVar38 + 0x10;
          } while (lVar38 != 0x80);
        }
        else {
          uVar33 = 4;
          if ((int)uVar37 < 4) {
            uVar33 = uVar37;
          }
          auVar47 = *(undefined1 (*) [16])(left + iVar40);
          if (upsample_left == 0) {
            auVar93 = *(undefined1 (*) [16])(left + (long)iVar40 + 1);
            uVar3 = (ushort)(uVar35 >> 1);
            uVar72 = uVar3 & 0x1f;
            auVar97._0_8_ = CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f
            ;
            auVar97._8_2_ = uVar72;
            auVar97._10_2_ = uVar72;
            auVar97._12_2_ = uVar72;
            auVar97._14_2_ = uVar72;
            auVar97._16_2_ = uVar72;
            auVar97._18_2_ = uVar72;
            auVar97._20_2_ = uVar72;
            auVar97._22_2_ = uVar72;
            auVar97._24_2_ = uVar72;
            auVar97._26_2_ = uVar72;
            auVar97._28_2_ = uVar72;
            auVar97._30_2_ = uVar72;
          }
          else {
            auVar47 = vpshufb_avx(auVar47,_DAT_005109e0);
            auVar93 = vpsrldq_avx(auVar47,8);
            auVar96._0_2_ = (undefined2)uVar35;
            auVar96._2_2_ = auVar96._0_2_;
            auVar96._4_2_ = auVar96._0_2_;
            auVar96._6_2_ = auVar96._0_2_;
            auVar96._8_2_ = auVar96._0_2_;
            auVar96._10_2_ = auVar96._0_2_;
            auVar96._12_2_ = auVar96._0_2_;
            auVar96._14_2_ = auVar96._0_2_;
            auVar96._16_2_ = auVar96._0_2_;
            auVar96._18_2_ = auVar96._0_2_;
            auVar96._20_2_ = auVar96._0_2_;
            auVar96._22_2_ = auVar96._0_2_;
            auVar96._24_2_ = auVar96._0_2_;
            auVar96._26_2_ = auVar96._0_2_;
            auVar96._28_2_ = auVar96._0_2_;
            auVar96._30_2_ = auVar96._0_2_;
            auVar76 = vpsllw_avx2(auVar96,ZEXT416((uint)upsample_left));
            auVar76 = vpsrlw_avx2(auVar76,1);
            auVar97 = vpand_avx2(auVar76,auVar78);
          }
          auVar76 = vpmovzxbw_avx2(auVar47);
          auVar84 = vpmovzxbw_avx2(auVar93);
          auVar84 = vpsubw_avx2(auVar84,auVar76);
          auVar84 = vpmullw_avx2(auVar84,auVar97);
          auVar76 = vpsllw_avx2(auVar76,5);
          auVar76 = vpaddw_avx2(auVar76,auVar59);
          auVar76 = vpaddw_avx2(auVar84,auVar76);
          auVar76 = vpsrlw_avx2(auVar76,5);
          auVar47 = vpackuswb_avx(auVar76._0_16_,auVar76._16_16_);
          auVar47 = vpblendvb_avx(auVar43,auVar47,*(undefined1 (*) [16])BaseMask[uVar33]);
          *(undefined1 (*) [16])(local_1060 + lVar34 * 0x10) = auVar47;
          uVar35 = uVar35 + dy;
        }
        if ((int)uVar37 < 1) break;
        lVar34 = lVar34 + 1;
        lVar31 = lVar31 + 0x10;
      } while (lVar34 != 8);
      auVar47 = vpunpcklbw_avx(local_1060,auStack_1050);
      auVar93 = vpunpcklbw_avx(local_1040,auStack_1030);
      auVar92 = vpunpcklbw_avx(local_1020,auStack_1010);
      auVar46 = vpunpcklbw_avx(local_1000,auStack_ff0);
      auVar47 = vpunpcklwd_avx(auVar47,auVar93);
      auVar93 = vpunpcklwd_avx(auVar92,auVar46);
      auVar92 = vpunpckldq_avx(auVar47,auVar93);
      *(long *)dst = auVar92._0_8_;
      uVar2 = vpextrq_avx(auVar92,1);
      *(undefined8 *)(dst + stride) = uVar2;
      auVar47 = vpunpckhdq_avx(auVar47,auVar93);
      *(long *)(dst + stride * 2) = auVar47._0_8_;
      lVar31 = stride * 3;
      goto LAB_00357e3f;
    case 1:
      iVar36 = 0x17 << (bVar4 & 0x1f);
      uVar1 = left[iVar36];
      auVar54[1] = uVar1;
      auVar54[0] = uVar1;
      auVar54[2] = uVar1;
      auVar54[3] = uVar1;
      auVar54[4] = uVar1;
      auVar54[5] = uVar1;
      auVar54[6] = uVar1;
      auVar54[7] = uVar1;
      auVar54[8] = uVar1;
      auVar54[9] = uVar1;
      auVar54[10] = uVar1;
      auVar54[0xb] = uVar1;
      auVar54[0xc] = uVar1;
      auVar54[0xd] = uVar1;
      auVar54[0xe] = uVar1;
      auVar54[0xf] = uVar1;
      auVar71._8_2_ = 0x10;
      auVar71._0_8_ = 0x10001000100010;
      auVar71._10_2_ = 0x10;
      auVar71._12_2_ = 0x10;
      auVar71._14_2_ = 0x10;
      auVar71._16_2_ = 0x10;
      auVar71._18_2_ = 0x10;
      auVar71._20_2_ = 0x10;
      auVar71._22_2_ = 0x10;
      auVar71._24_2_ = 0x10;
      auVar71._26_2_ = 0x10;
      auVar71._28_2_ = 0x10;
      auVar71._30_2_ = 0x10;
      lVar31 = 0;
      auVar91._8_2_ = 0x1f;
      auVar91._0_8_ = 0x1f001f001f001f;
      auVar91._10_2_ = 0x1f;
      auVar91._12_2_ = 0x1f;
      auVar91._14_2_ = 0x1f;
      auVar91._16_2_ = 0x1f;
      auVar91._18_2_ = 0x1f;
      auVar91._20_2_ = 0x1f;
      auVar91._22_2_ = 0x1f;
      auVar91._24_2_ = 0x1f;
      auVar91._26_2_ = 0x1f;
      auVar91._28_2_ = 0x1f;
      auVar91._30_2_ = 0x1f;
      lVar34 = 0;
      uVar35 = dy;
      do {
        iVar40 = (int)uVar35 >> (6 - bVar4 & 0x1f);
        uVar37 = iVar36 - iVar40 >> (bVar4 & 0x1f);
        lVar38 = lVar31;
        if ((int)uVar37 < 1) {
          do {
            *(undefined1 (*) [16])(local_1060 + lVar38) = auVar54;
            lVar38 = lVar38 + 0x10;
          } while (lVar38 != 0x100);
        }
        else {
          uVar33 = 8;
          if ((int)uVar37 < 8) {
            uVar33 = uVar37;
          }
          auVar47 = *(undefined1 (*) [16])(left + iVar40);
          if (upsample_left == 0) {
            auVar93 = *(undefined1 (*) [16])(left + (long)iVar40 + 1);
            uVar3 = (ushort)(uVar35 >> 1);
            uVar72 = uVar3 & 0x1f;
            auVar117._0_8_ =
                 CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
            auVar117._8_2_ = uVar72;
            auVar117._10_2_ = uVar72;
            auVar117._12_2_ = uVar72;
            auVar117._14_2_ = uVar72;
            auVar117._16_2_ = uVar72;
            auVar117._18_2_ = uVar72;
            auVar117._20_2_ = uVar72;
            auVar117._22_2_ = uVar72;
            auVar117._24_2_ = uVar72;
            auVar117._26_2_ = uVar72;
            auVar117._28_2_ = uVar72;
            auVar117._30_2_ = uVar72;
          }
          else {
            auVar47 = vpshufb_avx(auVar47,_DAT_005109e0);
            auVar93 = vpsrldq_avx(auVar47,8);
            auVar116._0_2_ = (undefined2)uVar35;
            auVar116._2_2_ = auVar116._0_2_;
            auVar116._4_2_ = auVar116._0_2_;
            auVar116._6_2_ = auVar116._0_2_;
            auVar116._8_2_ = auVar116._0_2_;
            auVar116._10_2_ = auVar116._0_2_;
            auVar116._12_2_ = auVar116._0_2_;
            auVar116._14_2_ = auVar116._0_2_;
            auVar116._16_2_ = auVar116._0_2_;
            auVar116._18_2_ = auVar116._0_2_;
            auVar116._20_2_ = auVar116._0_2_;
            auVar116._22_2_ = auVar116._0_2_;
            auVar116._24_2_ = auVar116._0_2_;
            auVar116._26_2_ = auVar116._0_2_;
            auVar116._28_2_ = auVar116._0_2_;
            auVar116._30_2_ = auVar116._0_2_;
            auVar76 = vpsllw_avx2(auVar116,ZEXT416((uint)upsample_left));
            auVar76 = vpsrlw_avx2(auVar76,1);
            auVar117 = vpand_avx2(auVar76,auVar91);
          }
          auVar76 = vpmovzxbw_avx2(auVar47);
          auVar84 = vpmovzxbw_avx2(auVar93);
          auVar84 = vpsubw_avx2(auVar84,auVar76);
          auVar84 = vpmullw_avx2(auVar84,auVar117);
          auVar76 = vpsllw_avx2(auVar76,5);
          auVar76 = vpaddw_avx2(auVar76,auVar71);
          auVar76 = vpaddw_avx2(auVar84,auVar76);
          auVar76 = vpsrlw_avx2(auVar76,5);
          auVar47 = vpackuswb_avx(auVar76._0_16_,auVar76._16_16_);
          auVar47 = vpblendvb_avx(auVar54,auVar47,*(undefined1 (*) [16])BaseMask[uVar33]);
          *(undefined1 (*) [16])(local_1060 + lVar34 * 0x10) = auVar47;
          uVar35 = uVar35 + dy;
        }
        if ((int)uVar37 < 1) break;
        lVar34 = lVar34 + 1;
        lVar31 = lVar31 + 0x10;
      } while (lVar34 != 0x10);
      auVar92 = vpunpcklbw_avx(local_1060,auStack_1050);
      auVar46 = vpunpcklbw_avx(local_1040,auStack_1030);
      auVar51 = vpunpcklbw_avx(local_1020,auStack_1010);
      auVar53 = vpunpcklbw_avx(local_1000,auStack_ff0);
      auVar42 = vpunpcklbw_avx(local_fe0,auStack_fd0);
      auVar48 = vpunpcklbw_avx(local_fc0,auStack_fb0);
      auVar44 = vpunpcklbw_avx(local_fa0,auStack_f90);
      auVar50 = vpunpcklbw_avx(local_f80,auStack_f70);
      auVar47 = vpunpcklwd_avx(auVar92,auVar46);
      auVar93 = vpunpcklwd_avx(auVar51,auVar53);
      auVar49 = vpunpcklwd_avx(auVar42,auVar48);
      auVar45 = vpunpcklwd_avx(auVar44,auVar50);
      auVar52 = vpunpckldq_avx(auVar47,auVar93);
      auVar47 = vpunpckhdq_avx(auVar47,auVar93);
      auVar54 = vpunpckldq_avx(auVar49,auVar45);
      auVar93 = vpunpckhdq_avx(auVar49,auVar45);
      local_1460._0_16_ = vpunpcklqdq_avx(auVar52,auVar54);
      unique0x00102d80 = vpunpckhqdq_avx(auVar52,auVar54);
      local_1440._0_16_ = vpunpcklqdq_avx(auVar47,auVar93);
      local_1440._16_16_ = vpunpckhqdq_avx(auVar47,auVar93);
      auVar47 = vpunpckhwd_avx(auVar92,auVar46);
      auVar93 = vpunpckhwd_avx(auVar51,auVar53);
      auVar92 = vpunpckhwd_avx(auVar42,auVar48);
      auVar46 = vpunpckhwd_avx(auVar44,auVar50);
      auVar51 = vpunpckldq_avx(auVar47,auVar93);
      auVar47 = vpunpckhdq_avx(auVar47,auVar93);
      auVar53 = vpunpckldq_avx(auVar92,auVar46);
      auVar93 = vpunpckhdq_avx(auVar92,auVar46);
      local_1420._0_16_ = vpunpcklqdq_avx(auVar51,auVar53);
      local_1420._16_16_ = vpunpckhqdq_avx(auVar51,auVar53);
      local_1400._0_16_ = vpunpcklqdq_avx(auVar47,auVar93);
      local_1400._16_16_ = vpunpckhqdq_avx(auVar47,auVar93);
      lVar31 = 0;
      do {
        uVar2 = *(undefined8 *)(local_1460 + lVar31 + 8);
        *(undefined8 *)dst = *(undefined8 *)(local_1460 + lVar31);
        *(undefined8 *)(dst + 8) = uVar2;
        lVar31 = lVar31 + 0x10;
        dst = dst + stride;
      } while (lVar31 != 0x80);
      break;
    case 3:
      iVar36 = 0x2f << (bVar4 & 0x1f);
      uVar1 = left[iVar36];
      auVar52[1] = uVar1;
      auVar52[0] = uVar1;
      auVar52[2] = uVar1;
      auVar52[3] = uVar1;
      auVar52[4] = uVar1;
      auVar52[5] = uVar1;
      auVar52[6] = uVar1;
      auVar52[7] = uVar1;
      auVar52[8] = uVar1;
      auVar52[9] = uVar1;
      auVar52[10] = uVar1;
      auVar52[0xb] = uVar1;
      auVar52[0xc] = uVar1;
      auVar52[0xd] = uVar1;
      auVar52[0xe] = uVar1;
      auVar52[0xf] = uVar1;
      auVar69._8_2_ = 0x10;
      auVar69._0_8_ = 0x10001000100010;
      auVar69._10_2_ = 0x10;
      auVar69._12_2_ = 0x10;
      auVar69._14_2_ = 0x10;
      auVar69._16_2_ = 0x10;
      auVar69._18_2_ = 0x10;
      auVar69._20_2_ = 0x10;
      auVar69._22_2_ = 0x10;
      auVar69._24_2_ = 0x10;
      auVar69._26_2_ = 0x10;
      auVar69._28_2_ = 0x10;
      auVar69._30_2_ = 0x10;
      lVar31 = 0;
      auVar89._8_2_ = 0x1f;
      auVar89._0_8_ = 0x1f001f001f001f;
      auVar89._10_2_ = 0x1f;
      auVar89._12_2_ = 0x1f;
      auVar89._14_2_ = 0x1f;
      auVar89._16_2_ = 0x1f;
      auVar89._18_2_ = 0x1f;
      auVar89._20_2_ = 0x1f;
      auVar89._22_2_ = 0x1f;
      auVar89._24_2_ = 0x1f;
      auVar89._26_2_ = 0x1f;
      auVar89._28_2_ = 0x1f;
      auVar89._30_2_ = 0x1f;
      lVar34 = 0;
      uVar35 = dy;
      do {
        iVar40 = (int)uVar35 >> (6 - bVar4 & 0x1f);
        uVar37 = iVar36 - iVar40 >> (bVar4 & 0x1f);
        lVar38 = lVar31;
        if ((int)uVar37 < 1) {
          do {
            *(undefined1 (*) [16])(local_1060 + lVar38) = auVar52;
            lVar38 = lVar38 + 0x10;
          } while (lVar38 != 0x200);
        }
        else {
          uVar33 = 0x10;
          if ((int)uVar37 < 0x10) {
            uVar33 = uVar37;
          }
          auVar47 = *(undefined1 (*) [16])(left + iVar40);
          if (upsample_left == 0) {
            auVar93 = *(undefined1 (*) [16])(left + (long)iVar40 + 1);
            uVar3 = (ushort)(uVar35 >> 1);
            uVar72 = uVar3 & 0x1f;
            auVar113._0_8_ =
                 CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
            auVar113._8_2_ = uVar72;
            auVar113._10_2_ = uVar72;
            auVar113._12_2_ = uVar72;
            auVar113._14_2_ = uVar72;
            auVar113._16_2_ = uVar72;
            auVar113._18_2_ = uVar72;
            auVar113._20_2_ = uVar72;
            auVar113._22_2_ = uVar72;
            auVar113._24_2_ = uVar72;
            auVar113._26_2_ = uVar72;
            auVar113._28_2_ = uVar72;
            auVar113._30_2_ = uVar72;
          }
          else {
            auVar47 = vpshufb_avx(auVar47,_DAT_005109e0);
            auVar93 = vpsrldq_avx(auVar47,8);
            auVar112._0_2_ = (undefined2)uVar35;
            auVar112._2_2_ = auVar112._0_2_;
            auVar112._4_2_ = auVar112._0_2_;
            auVar112._6_2_ = auVar112._0_2_;
            auVar112._8_2_ = auVar112._0_2_;
            auVar112._10_2_ = auVar112._0_2_;
            auVar112._12_2_ = auVar112._0_2_;
            auVar112._14_2_ = auVar112._0_2_;
            auVar112._16_2_ = auVar112._0_2_;
            auVar112._18_2_ = auVar112._0_2_;
            auVar112._20_2_ = auVar112._0_2_;
            auVar112._22_2_ = auVar112._0_2_;
            auVar112._24_2_ = auVar112._0_2_;
            auVar112._26_2_ = auVar112._0_2_;
            auVar112._28_2_ = auVar112._0_2_;
            auVar112._30_2_ = auVar112._0_2_;
            auVar76 = vpsllw_avx2(auVar112,ZEXT416((uint)upsample_left));
            auVar76 = vpsrlw_avx2(auVar76,1);
            auVar113 = vpand_avx2(auVar76,auVar89);
          }
          auVar76 = vpmovzxbw_avx2(auVar47);
          auVar84 = vpmovzxbw_avx2(auVar93);
          auVar84 = vpsubw_avx2(auVar84,auVar76);
          auVar84 = vpmullw_avx2(auVar84,auVar113);
          auVar76 = vpsllw_avx2(auVar76,5);
          auVar76 = vpaddw_avx2(auVar76,auVar69);
          auVar76 = vpaddw_avx2(auVar84,auVar76);
          auVar76 = vpsrlw_avx2(auVar76,5);
          auVar47 = vpackuswb_avx(auVar76._0_16_,auVar76._16_16_);
          auVar47 = vpblendvb_avx(auVar52,auVar47,*(undefined1 (*) [16])BaseMask[uVar33]);
          *(undefined1 (*) [16])(local_1060 + lVar34 * 0x10) = auVar47;
          uVar35 = uVar35 + dy;
        }
        if ((int)uVar37 < 1) break;
        lVar34 = lVar34 + 1;
        lVar31 = lVar31 + 0x10;
      } while (lVar34 != 0x20);
      lVar31 = 0;
      do {
        lVar34 = lVar31 * 0x10;
        auVar92 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_1060 + lVar34),
                                 *(undefined1 (*) [16])(auStack_1050 + lVar34));
        auVar46 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_1040 + lVar34),
                                 *(undefined1 (*) [16])(auStack_1030 + lVar34));
        auVar51 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_1020 + lVar34),
                                 *(undefined1 (*) [16])(auStack_1010 + lVar34));
        auVar53 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_1000 + lVar34),
                                 *(undefined1 (*) [16])(auStack_ff0 + lVar34));
        auVar47 = vpunpcklwd_avx(auVar92,auVar46);
        auVar93 = vpunpcklwd_avx(auVar51,auVar53);
        auVar45 = vpunpckldq_avx(auVar47,auVar93);
        auVar47 = vpunpckhdq_avx(auVar47,auVar93);
        auVar42 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_fe0 + lVar34),
                                 *(undefined1 (*) [16])(auStack_fd0 + lVar34));
        auVar48 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_fc0 + lVar34),
                                 *(undefined1 (*) [16])(auStack_fb0 + lVar34));
        auVar44 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_fa0 + lVar34),
                                 *(undefined1 (*) [16])(auStack_f90 + lVar34));
        auVar50 = vpunpcklbw_avx(*(undefined1 (*) [16])(local_f80 + lVar34),
                                 *(undefined1 (*) [16])(auStack_f70 + lVar34));
        auVar93 = vpunpcklwd_avx(auVar42,auVar48);
        auVar49 = vpunpcklwd_avx(auVar44,auVar50);
        auVar52 = vpunpckldq_avx(auVar93,auVar49);
        auVar93 = vpunpckhdq_avx(auVar93,auVar49);
        local_1460._0_16_ = vpunpcklqdq_avx(auVar45,auVar52);
        unique0x00102d80 = vpunpckhqdq_avx(auVar45,auVar52);
        local_1440._0_16_ = vpunpcklqdq_avx(auVar47,auVar93);
        local_1440._16_16_ = vpunpckhqdq_avx(auVar47,auVar93);
        auVar47 = vpunpckhwd_avx(auVar92,auVar46);
        auVar93 = vpunpckhwd_avx(auVar51,auVar53);
        auVar92 = vpunpckhwd_avx(auVar42,auVar48);
        auVar46 = vpunpckhwd_avx(auVar44,auVar50);
        auVar51 = vpunpckldq_avx(auVar47,auVar93);
        auVar47 = vpunpckhdq_avx(auVar47,auVar93);
        auVar53 = vpunpckldq_avx(auVar92,auVar46);
        auVar93 = vpunpckhdq_avx(auVar92,auVar46);
        local_1420._0_16_ = vpunpcklqdq_avx(auVar51,auVar53);
        local_1420._16_16_ = vpunpckhqdq_avx(auVar51,auVar53);
        local_1400._0_16_ = vpunpcklqdq_avx(auVar47,auVar93);
        local_1400._16_16_ = vpunpckhqdq_avx(auVar47,auVar93);
        auVar47 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_1060 + lVar34),
                                 *(undefined1 (*) [16])(auStack_1050 + lVar34));
        auVar93 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_1040 + lVar34),
                                 *(undefined1 (*) [16])(auStack_1030 + lVar34));
        auVar92 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_1020 + lVar34),
                                 *(undefined1 (*) [16])(auStack_1010 + lVar34));
        auVar46 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_1000 + lVar34),
                                 *(undefined1 (*) [16])(auStack_ff0 + lVar34));
        auVar51 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_fe0 + lVar34),
                                 *(undefined1 (*) [16])(auStack_fd0 + lVar34));
        auVar53 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_fc0 + lVar34),
                                 *(undefined1 (*) [16])(auStack_fb0 + lVar34));
        auVar42 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_fa0 + lVar34),
                                 *(undefined1 (*) [16])(auStack_f90 + lVar34));
        auVar48 = vpunpckhbw_avx(*(undefined1 (*) [16])(local_f80 + lVar34),
                                 *(undefined1 (*) [16])(auStack_f70 + lVar34));
        auVar44 = vpunpcklwd_avx(auVar47,auVar93);
        auVar50 = vpunpcklwd_avx(auVar92,auVar46);
        auVar49 = vpunpcklwd_avx(auVar51,auVar53);
        auVar45 = vpunpcklwd_avx(auVar42,auVar48);
        auVar52 = vpunpckldq_avx(auVar44,auVar50);
        auVar44 = vpunpckhdq_avx(auVar44,auVar50);
        auVar54 = vpunpckldq_avx(auVar49,auVar45);
        auVar50 = vpunpckhdq_avx(auVar49,auVar45);
        local_13e0._0_16_ = vpunpcklqdq_avx(auVar52,auVar54);
        local_13e0._16_16_ = vpunpckhqdq_avx(auVar52,auVar54);
        local_13c0._0_16_ = vpunpcklqdq_avx(auVar44,auVar50);
        local_13c0._16_16_ = vpunpckhqdq_avx(auVar44,auVar50);
        auVar47 = vpunpckhwd_avx(auVar47,auVar93);
        auVar93 = vpunpckhwd_avx(auVar92,auVar46);
        auVar92 = vpunpckhwd_avx(auVar51,auVar53);
        auVar46 = vpunpckhwd_avx(auVar42,auVar48);
        auVar51 = vpunpckldq_avx(auVar47,auVar93);
        auVar47 = vpunpckhdq_avx(auVar47,auVar93);
        auVar53 = vpunpckldq_avx(auVar92,auVar46);
        auVar93 = vpunpckhdq_avx(auVar92,auVar46);
        local_13a0._0_16_ = vpunpcklqdq_avx(auVar51,auVar53);
        local_13a0._16_16_ = vpunpckhqdq_avx(auVar51,auVar53);
        local_1380._0_16_ = vpunpcklqdq_avx(auVar47,auVar93);
        local_1380._16_16_ = vpunpckhqdq_avx(auVar47,auVar93);
        lVar34 = 0;
        puVar32 = dst;
        do {
          uVar2 = *(undefined8 *)(local_1460 + lVar34 + 8);
          *(undefined8 *)puVar32 = *(undefined8 *)(local_1460 + lVar34);
          *(undefined8 *)(puVar32 + 8) = uVar2;
          lVar34 = lVar34 + 0x10;
          puVar32 = puVar32 + stride;
        } while (lVar34 != 0x100);
        dst = dst + 0x10;
        bVar41 = lVar31 == 0;
        lVar31 = lVar31 + 0x10;
      } while (bVar41);
      break;
    case 7:
      uStack_1608 = 0x35ab35;
      dr_prediction_z1_32xN_avx2(0x40,local_1060,0x20,left,dy,iVar36);
      pitchSrc = 0x20;
      iVar36 = 0x40;
      iVar40 = 0x20;
      goto LAB_0035ab01;
    }
  }
  return;
}

Assistant:

void av1_dr_prediction_z3_avx2(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                               const uint8_t *above, const uint8_t *left,
                               int upsample_left, int dx, int dy) {
  (void)above;
  (void)dx;
  assert(dx == 1);
  assert(dy > 0);

  if (bw == bh) {
    switch (bw) {
      case 4:
        dr_prediction_z3_4x4_avx2(dst, stride, left, upsample_left, dy);
        break;
      case 8:
        dr_prediction_z3_8x8_avx2(dst, stride, left, upsample_left, dy);
        break;
      case 16:
        dr_prediction_z3_16x16_avx2(dst, stride, left, upsample_left, dy);
        break;
      case 32:
        dr_prediction_z3_32x32_avx2(dst, stride, left, upsample_left, dy);
        break;
      case 64:
        dr_prediction_z3_64x64_avx2(dst, stride, left, upsample_left, dy);
        break;
    }
  } else {
    if (bw < bh) {
      if (bw + bw == bh) {
        switch (bw) {
          case 4:
            dr_prediction_z3_4x8_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_8x16_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_16x32_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 32:
            dr_prediction_z3_32x64_avx2(dst, stride, left, upsample_left, dy);
            break;
        }
      } else {
        switch (bw) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            dr_prediction_z3_4x16_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_8x32_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_16x64_avx2(dst, stride, left, upsample_left, dy);
            break;
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    } else {
      if (bh + bh == bw) {
        switch (bh) {
          case 4:
            dr_prediction_z3_8x4_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_16x8_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_32x16_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 32:
            dr_prediction_z3_64x32_avx2(dst, stride, left, upsample_left, dy);
            break;
        }
      } else {
        switch (bh) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            dr_prediction_z3_16x4_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_32x8_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_64x16_avx2(dst, stride, left, upsample_left, dy);
            break;
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    }
  }
}